

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

BBox3fa * __thiscall
embree::SceneGraph::Transformations::bounds(Transformations *this,BBox3fa *cbounds)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float *in_RDX;
  long in_RSI;
  BBox3fa *in_RDI;
  float fVar84;
  size_t i;
  BBox3fa *r;
  Vec3fa p7;
  Vec3fa p6;
  Vec3fa p5;
  Vec3fa p4;
  Vec3fa p3;
  Vec3fa p2;
  Vec3fa p1;
  Vec3fa p0;
  BBox3fa *dst;
  undefined8 local_2a28;
  undefined8 uStack_2a20;
  undefined8 local_2a18;
  undefined8 uStack_2a10;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  undefined8 local_29f8;
  undefined8 uStack_29f0;
  undefined8 local_29e8;
  undefined8 uStack_29e0;
  undefined8 local_29d8;
  undefined8 uStack_29d0;
  ulong local_29c8;
  float *local_29b8;
  long local_29a0;
  ulong local_2998;
  long local_2990;
  undefined8 *local_2988;
  undefined8 *local_2980;
  undefined8 *local_2978;
  undefined8 *local_2970;
  undefined8 *local_2968;
  undefined8 *local_2960;
  undefined8 local_2958;
  undefined8 uStack_2950;
  undefined8 *local_2940;
  undefined8 *local_2938;
  undefined8 *local_2930;
  undefined8 local_2928;
  undefined8 uStack_2920;
  undefined8 *local_2910;
  undefined8 *local_2908;
  undefined8 *local_2900;
  undefined8 local_28f8;
  undefined8 uStack_28f0;
  undefined8 *local_28e0;
  undefined8 *local_28d8;
  undefined8 *local_28d0;
  undefined8 local_28c8;
  undefined8 uStack_28c0;
  undefined8 *local_28b0;
  float local_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float local_2884;
  Vec3fa *local_2880;
  float local_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float local_2868;
  undefined1 *local_2858;
  undefined1 *local_2850;
  undefined8 local_2848;
  undefined8 uStack_2840;
  undefined8 local_2838;
  undefined8 uStack_2830;
  undefined8 *local_2828;
  undefined8 *local_2818;
  Vec3fa *local_2810;
  undefined8 *local_2808;
  undefined8 local_27f8;
  undefined8 uStack_27f0;
  undefined8 local_27e8;
  ulong uStack_27e0;
  undefined8 local_27d8;
  undefined8 uStack_27d0;
  undefined8 local_27c8;
  ulong uStack_27c0;
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  undefined8 local_27a8;
  ulong uStack_27a0;
  undefined8 local_2798;
  undefined8 uStack_2790;
  undefined8 local_2788;
  ulong uStack_2780;
  undefined8 local_2778;
  undefined8 uStack_2770;
  undefined8 local_2768;
  ulong uStack_2760;
  undefined8 local_2758;
  undefined8 uStack_2750;
  undefined8 local_2748;
  ulong uStack_2740;
  undefined8 local_2738;
  undefined8 uStack_2730;
  undefined8 local_2728;
  ulong uStack_2720;
  undefined8 local_2718;
  undefined8 uStack_2710;
  undefined8 local_2708;
  ulong uStack_2700;
  float *local_26f0;
  undefined8 *local_26e8;
  undefined8 *local_26e0;
  float local_26d4;
  float local_26d0;
  float local_26cc;
  undefined8 *local_26c8;
  float local_26bc;
  float local_26b8;
  float local_26b4;
  undefined8 *local_26b0;
  float local_26a4;
  float local_26a0;
  float local_269c;
  undefined8 *local_2698;
  float local_268c;
  float local_2688;
  float local_2684;
  undefined8 *local_2680;
  float local_2674;
  float local_2670;
  float local_266c;
  undefined8 *local_2668;
  float local_265c;
  float local_2658;
  float local_2654;
  undefined8 *local_2650;
  float local_2644;
  float local_2640;
  float local_263c;
  undefined8 *local_2638;
  float local_262c;
  float local_2628;
  float local_2624;
  undefined8 *local_2620;
  undefined8 local_2618;
  ulong uStack_2610;
  float local_2608;
  float local_2604;
  float local_2600;
  undefined4 local_25fc;
  undefined8 local_25f8;
  ulong uStack_25f0;
  float local_25e8;
  float local_25e4;
  float local_25e0;
  undefined4 local_25dc;
  undefined8 local_25d8;
  ulong uStack_25d0;
  float local_25c8;
  float local_25c4;
  float local_25c0;
  undefined4 local_25bc;
  undefined8 local_25b8;
  ulong uStack_25b0;
  float local_25a8;
  float local_25a4;
  float local_25a0;
  undefined4 local_259c;
  undefined8 local_2598;
  ulong uStack_2590;
  float local_2588;
  float local_2584;
  float local_2580;
  undefined4 local_257c;
  undefined8 local_2578;
  ulong uStack_2570;
  float local_2568;
  float local_2564;
  float local_2560;
  undefined4 local_255c;
  undefined8 local_2558;
  ulong uStack_2550;
  float local_2548;
  float local_2544;
  float local_2540;
  undefined4 local_253c;
  undefined8 local_2538;
  ulong uStack_2530;
  float local_2528;
  float local_2524;
  float local_2520;
  undefined4 local_251c;
  undefined8 local_2518;
  undefined8 uStack_2510;
  undefined8 local_2508;
  undefined8 uStack_2500;
  undefined8 local_24f8;
  undefined8 uStack_24f0;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  undefined8 local_24d8;
  undefined8 uStack_24d0;
  undefined8 *local_24c0;
  undefined8 *local_24b8;
  undefined8 *local_24b0;
  float local_24a4;
  undefined8 *local_24a0;
  float local_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float local_2488;
  float local_2484;
  undefined8 *local_2480;
  float local_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float local_2468;
  float local_2464;
  undefined8 *local_2460;
  float local_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float local_2448;
  undefined8 local_2438;
  undefined8 uStack_2430;
  undefined8 *local_2420;
  undefined8 *local_2418;
  undefined8 *local_2410;
  undefined8 *local_2408;
  undefined8 *local_2400;
  undefined8 *local_23f8;
  undefined8 *local_23f0;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  float local_23c8;
  float fStack_23c4;
  float fStack_23c0;
  float fStack_23bc;
  undefined8 *local_23b8;
  undefined8 *local_23b0;
  undefined8 *local_23a8;
  undefined8 *local_23a0;
  undefined8 local_2398;
  undefined8 uStack_2390;
  undefined8 local_2388;
  undefined8 uStack_2380;
  float local_2378;
  float fStack_2374;
  float fStack_2370;
  float fStack_236c;
  undefined8 *local_2360;
  undefined8 local_2358;
  undefined8 uStack_2350;
  undefined8 *local_2340;
  undefined8 *local_2338;
  undefined8 *local_2330;
  undefined8 *local_2328;
  undefined8 *local_2320;
  undefined8 *local_2318;
  undefined8 *local_2310;
  undefined8 local_2308;
  undefined8 uStack_2300;
  undefined8 local_22f8;
  undefined8 uStack_22f0;
  float local_22e8;
  float fStack_22e4;
  float fStack_22e0;
  float fStack_22dc;
  undefined8 *local_22d8;
  undefined8 *local_22d0;
  undefined8 *local_22c8;
  undefined8 *local_22c0;
  undefined8 local_22b8;
  undefined8 uStack_22b0;
  undefined8 local_22a8;
  undefined8 uStack_22a0;
  float local_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  undefined8 *local_2280;
  undefined8 local_2278;
  undefined8 uStack_2270;
  undefined8 *local_2260;
  undefined8 *local_2258;
  undefined8 *local_2250;
  undefined8 *local_2248;
  undefined8 *local_2240;
  undefined8 *local_2238;
  undefined8 *local_2230;
  undefined8 local_2228;
  undefined8 uStack_2220;
  undefined8 local_2218;
  undefined8 uStack_2210;
  float local_2208;
  float fStack_2204;
  float fStack_2200;
  float fStack_21fc;
  undefined8 *local_21f8;
  undefined8 *local_21f0;
  undefined8 *local_21e8;
  undefined8 *local_21e0;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  float local_21b8;
  float fStack_21b4;
  float fStack_21b0;
  float fStack_21ac;
  undefined8 *local_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  undefined8 local_2178;
  undefined8 uStack_2170;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined8 *local_2140;
  undefined8 *local_2138;
  undefined8 *local_2130;
  float local_2124;
  undefined8 *local_2120;
  float local_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float local_2108;
  float local_2104;
  undefined8 *local_2100;
  float local_20f8;
  float fStack_20f4;
  float fStack_20f0;
  float fStack_20ec;
  float local_20e8;
  float local_20e4;
  undefined8 *local_20e0;
  float local_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float local_20bc;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined8 *local_20a0;
  undefined8 *local_2098;
  undefined8 *local_2090;
  undefined8 *local_2088;
  undefined8 *local_2080;
  undefined8 *local_2078;
  undefined8 *local_2070;
  undefined8 local_2068;
  undefined8 uStack_2060;
  undefined8 local_2058;
  undefined8 uStack_2050;
  float local_2048;
  float fStack_2044;
  float fStack_2040;
  float fStack_203c;
  undefined8 *local_2038;
  undefined8 *local_2030;
  undefined8 *local_2028;
  undefined8 *local_2020;
  undefined8 local_2018;
  undefined8 uStack_2010;
  undefined8 local_2008;
  undefined8 uStack_2000;
  float local_1ff8;
  float fStack_1ff4;
  float fStack_1ff0;
  float fStack_1fec;
  undefined8 *local_1fe0;
  undefined8 local_1fd8;
  undefined8 uStack_1fd0;
  undefined8 *local_1fc0;
  undefined8 *local_1fb8;
  undefined8 *local_1fb0;
  undefined8 *local_1fa8;
  undefined8 *local_1fa0;
  undefined8 *local_1f98;
  undefined8 *local_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  float local_1f68;
  float fStack_1f64;
  float fStack_1f60;
  float fStack_1f5c;
  undefined8 *local_1f58;
  undefined8 *local_1f50;
  undefined8 *local_1f48;
  undefined8 *local_1f40;
  undefined8 local_1f38;
  undefined8 uStack_1f30;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  float local_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  undefined8 *local_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 *local_1ee0;
  undefined8 *local_1ed8;
  undefined8 *local_1ed0;
  undefined8 *local_1ec8;
  undefined8 *local_1ec0;
  undefined8 *local_1eb8;
  undefined8 *local_1eb0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  float local_1e88;
  float fStack_1e84;
  float fStack_1e80;
  float fStack_1e7c;
  undefined8 *local_1e78;
  undefined8 *local_1e70;
  undefined8 *local_1e68;
  undefined8 *local_1e60;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  float local_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  undefined8 *local_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 *local_1dc0;
  undefined8 *local_1db8;
  undefined8 *local_1db0;
  float local_1da4;
  undefined8 *local_1da0;
  float local_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float local_1d88;
  float local_1d84;
  undefined8 *local_1d80;
  float local_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float local_1d68;
  float local_1d64;
  undefined8 *local_1d60;
  float local_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float local_1d3c;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 *local_1d20;
  undefined8 *local_1d18;
  undefined8 *local_1d10;
  undefined8 *local_1d08;
  undefined8 *local_1d00;
  undefined8 *local_1cf8;
  undefined8 *local_1cf0;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  float local_1cc8;
  float fStack_1cc4;
  float fStack_1cc0;
  float fStack_1cbc;
  undefined8 *local_1cb8;
  undefined8 *local_1cb0;
  undefined8 *local_1ca8;
  undefined8 *local_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  float local_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  undefined8 *local_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 *local_1c40;
  undefined8 *local_1c38;
  undefined8 *local_1c30;
  undefined8 *local_1c28;
  undefined8 *local_1c20;
  undefined8 *local_1c18;
  undefined8 *local_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  float local_1be8;
  float fStack_1be4;
  float fStack_1be0;
  float fStack_1bdc;
  undefined8 *local_1bd8;
  undefined8 *local_1bd0;
  undefined8 *local_1bc8;
  undefined8 *local_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  float local_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  undefined8 *local_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 *local_1b60;
  undefined8 *local_1b58;
  undefined8 *local_1b50;
  undefined8 *local_1b48;
  undefined8 *local_1b40;
  undefined8 *local_1b38;
  undefined8 *local_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  float local_1b08;
  float fStack_1b04;
  float fStack_1b00;
  float fStack_1afc;
  undefined8 *local_1af8;
  undefined8 *local_1af0;
  undefined8 *local_1ae8;
  undefined8 *local_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  float local_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  undefined8 *local_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 *local_1a40;
  undefined8 *local_1a38;
  undefined8 *local_1a30;
  float local_1a24;
  undefined8 *local_1a20;
  float local_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  float local_1a08;
  float local_1a04;
  undefined8 *local_1a00;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  float local_19e8;
  float local_19e4;
  undefined8 *local_19e0;
  float local_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  float local_19bc;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 *local_19a0;
  undefined8 *local_1998;
  undefined8 *local_1990;
  undefined8 *local_1988;
  undefined8 *local_1980;
  undefined8 *local_1978;
  undefined8 *local_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  float local_1948;
  float fStack_1944;
  float fStack_1940;
  float fStack_193c;
  undefined8 *local_1938;
  undefined8 *local_1930;
  undefined8 *local_1928;
  undefined8 *local_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  undefined8 *local_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 *local_18c0;
  undefined8 *local_18b8;
  undefined8 *local_18b0;
  undefined8 *local_18a8;
  undefined8 *local_18a0;
  undefined8 *local_1898;
  undefined8 *local_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  float local_1868;
  float fStack_1864;
  float fStack_1860;
  float fStack_185c;
  undefined8 *local_1858;
  undefined8 *local_1850;
  undefined8 *local_1848;
  undefined8 *local_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  float local_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  undefined8 *local_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 *local_17e0;
  undefined8 *local_17d8;
  undefined8 *local_17d0;
  undefined8 *local_17c8;
  undefined8 *local_17c0;
  undefined8 *local_17b8;
  undefined8 *local_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  float local_1788;
  float fStack_1784;
  float fStack_1780;
  float fStack_177c;
  undefined8 *local_1778;
  undefined8 *local_1770;
  undefined8 *local_1768;
  undefined8 *local_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  undefined8 *local_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 *local_16c0;
  undefined8 *local_16b8;
  undefined8 *local_16b0;
  float local_16a4;
  undefined8 *local_16a0;
  float local_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float local_1688;
  float local_1684;
  undefined8 *local_1680;
  float local_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  float local_1668;
  float local_1664;
  undefined8 *local_1660;
  float local_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float local_163c;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 *local_1620;
  undefined8 *local_1618;
  undefined8 *local_1610;
  undefined8 *local_1608;
  undefined8 *local_1600;
  undefined8 *local_15f8;
  undefined8 *local_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  float local_15c8;
  float fStack_15c4;
  float fStack_15c0;
  float fStack_15bc;
  undefined8 *local_15b8;
  undefined8 *local_15b0;
  undefined8 *local_15a8;
  undefined8 *local_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  float local_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  undefined8 *local_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 *local_1540;
  undefined8 *local_1538;
  undefined8 *local_1530;
  undefined8 *local_1528;
  undefined8 *local_1520;
  undefined8 *local_1518;
  undefined8 *local_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  float local_14e8;
  float fStack_14e4;
  float fStack_14e0;
  float fStack_14dc;
  undefined8 *local_14d8;
  undefined8 *local_14d0;
  undefined8 *local_14c8;
  undefined8 *local_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  float local_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  undefined8 *local_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 *local_1460;
  undefined8 *local_1458;
  undefined8 *local_1450;
  undefined8 *local_1448;
  undefined8 *local_1440;
  undefined8 *local_1438;
  undefined8 *local_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  float local_1408;
  float fStack_1404;
  float fStack_1400;
  float fStack_13fc;
  undefined8 *local_13f8;
  undefined8 *local_13f0;
  undefined8 *local_13e8;
  undefined8 *local_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  undefined8 *local_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 *local_1340;
  undefined8 *local_1338;
  undefined8 *local_1330;
  float local_1324;
  undefined8 *local_1320;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float local_1308;
  float local_1304;
  undefined8 *local_1300;
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float local_12e8;
  float local_12e4;
  undefined8 *local_12e0;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float local_12bc;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 *local_12a0;
  undefined8 *local_1298;
  undefined8 *local_1290;
  undefined8 *local_1288;
  undefined8 *local_1280;
  undefined8 *local_1278;
  undefined8 *local_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined8 *local_1238;
  undefined8 *local_1230;
  undefined8 *local_1228;
  undefined8 *local_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  undefined8 *local_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 *local_11c0;
  undefined8 *local_11b8;
  undefined8 *local_11b0;
  undefined8 *local_11a8;
  undefined8 *local_11a0;
  undefined8 *local_1198;
  undefined8 *local_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  undefined8 *local_1158;
  undefined8 *local_1150;
  undefined8 *local_1148;
  undefined8 *local_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined8 *local_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 *local_10e0;
  undefined8 *local_10d8;
  undefined8 *local_10d0;
  undefined8 *local_10c8;
  undefined8 *local_10c0;
  undefined8 *local_10b8;
  undefined8 *local_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined8 *local_1078;
  undefined8 *local_1070;
  undefined8 *local_1068;
  undefined8 *local_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined8 *local_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 *local_fc0;
  undefined8 *local_fb8;
  undefined8 *local_fb0;
  float local_fa4;
  undefined8 *local_fa0;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float local_f84;
  undefined8 *local_f80;
  float local_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float local_f68;
  float local_f64;
  undefined8 *local_f60;
  float local_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  float local_f3c;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 *local_f20;
  undefined8 *local_f18;
  undefined8 *local_f10;
  undefined8 *local_f08;
  undefined8 *local_f00;
  undefined8 *local_ef8;
  undefined8 *local_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  float local_ec8;
  float fStack_ec4;
  float fStack_ec0;
  float fStack_ebc;
  undefined8 *local_eb8;
  undefined8 *local_eb0;
  undefined8 *local_ea8;
  undefined8 *local_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  float local_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  undefined8 *local_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 *local_e40;
  undefined8 *local_e38;
  undefined8 *local_e30;
  undefined8 *local_e28;
  undefined8 *local_e20;
  undefined8 *local_e18;
  undefined8 *local_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  float local_de8;
  float fStack_de4;
  float fStack_de0;
  float fStack_ddc;
  undefined8 *local_dd8;
  undefined8 *local_dd0;
  undefined8 *local_dc8;
  undefined8 *local_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  float local_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  undefined8 *local_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 *local_d60;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  undefined8 *local_d38;
  undefined8 *local_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  undefined8 *local_cf8;
  undefined8 *local_cf0;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  float local_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  undefined8 *local_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 *local_c40;
  undefined8 *local_c38;
  undefined8 *local_c30;
  float local_c24;
  undefined8 *local_c20;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float local_c08;
  float local_c04;
  undefined8 *local_c00;
  float local_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float local_be8;
  float local_be4;
  undefined8 *local_be0;
  float local_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float local_bbc;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 *local_ba0;
  undefined8 *local_b98;
  undefined8 *local_b90;
  undefined8 *local_b88;
  undefined8 *local_b80;
  undefined8 *local_b78;
  undefined8 *local_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  undefined8 *local_b38;
  undefined8 *local_b30;
  undefined8 *local_b28;
  undefined8 *local_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  undefined8 *local_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 *local_ac0;
  undefined8 *local_ab8;
  undefined8 *local_ab0;
  undefined8 *local_aa8;
  undefined8 *local_aa0;
  undefined8 *local_a98;
  undefined8 *local_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  undefined8 *local_a58;
  undefined8 *local_a50;
  undefined8 *local_a48;
  undefined8 *local_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined8 *local_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 *local_9e0;
  undefined8 *local_9d8;
  undefined8 *local_9d0;
  undefined8 *local_9c8;
  undefined8 *local_9c0;
  undefined8 *local_9b8;
  undefined8 *local_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  undefined8 *local_978;
  undefined8 *local_970;
  undefined8 *local_968;
  undefined8 *local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  undefined8 *local_920;
  undefined8 *local_918;
  undefined8 *local_910;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f4;
  undefined8 *local_8f0;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d4;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b0;
  undefined1 local_8a8 [16];
  undefined8 *local_898;
  undefined8 *local_890;
  Vec3fa *local_888;
  undefined8 *local_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined1 local_858 [16];
  undefined8 *local_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 *local_7d8;
  undefined8 *local_7d0;
  undefined8 *local_7c8;
  undefined8 *local_7c0;
  undefined8 *local_7b8;
  undefined8 *local_7b0;
  undefined1 local_7a8 [16];
  undefined8 *local_798;
  undefined8 *local_790;
  undefined8 *local_788;
  undefined8 *local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined1 local_758 [16];
  undefined8 *local_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined1 local_6a8 [16];
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined1 local_658 [16];
  undefined8 *local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined1 local_5a8 [16];
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined1 local_558 [16];
  undefined8 *local_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined1 local_4a8 [16];
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined1 local_458 [16];
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined1 local_3a8 [16];
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined1 local_358 [16];
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined1 local_2a8 [16];
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined1 local_1a8 [16];
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined1 local_a8 [16];
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  ulong uStack_60;
  undefined1 local_58 [16];
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_2858 = &pos_inf;
  local_29b8 = in_RDX;
  local_2898 = std::numeric_limits<float>::infinity();
  *(ulong *)&(in_RDI->lower).field_0 = CONCAT44(local_2898,local_2898);
  *(ulong *)((long)&(in_RDI->lower).field_0 + 8) = CONCAT44(local_2898,local_2898);
  local_2850 = &neg_inf;
  fStack_2894 = local_2898;
  fStack_2890 = local_2898;
  fStack_288c = local_2898;
  local_2884 = local_2898;
  local_2880 = &in_RDI->upper;
  fVar84 = std::numeric_limits<float>::infinity();
  local_2878 = -fVar84;
  *(ulong *)&(in_RDI->upper).field_0 = CONCAT44(fVar84,fVar84) ^ 0x8000000080000000;
  *(ulong *)((long)&(in_RDI->upper).field_0 + 8) = CONCAT44(fVar84,fVar84) ^ 0x8000000080000000;
  fStack_2874 = local_2878;
  fStack_2870 = local_2878;
  fStack_286c = local_2878;
  local_2868 = local_2878;
  for (local_29c8 = 0; local_29a0 = in_RSI + 8, local_29c8 < *(ulong *)(in_RSI + 0x10);
      local_29c8 = local_29c8 + 1) {
    local_2990 = in_RSI + 8;
    local_2998 = local_29c8;
    local_2988 = (undefined8 *)(*(long *)(in_RSI + 0x20) + local_29c8 * 0x40);
    local_2980 = &local_2a28;
    local_28f8 = *local_2988;
    uStack_28f0 = local_2988[1];
    local_2930 = &local_2a18;
    local_2938 = local_2988 + 2;
    local_2928 = *local_2938;
    uStack_2920 = local_2988[3];
    local_2960 = &local_2a08;
    local_2968 = local_2988 + 4;
    local_2958 = *local_2968;
    uStack_2950 = local_2988[5];
    local_28d0 = &local_29f8;
    local_28d8 = local_2988 + 6;
    local_28c8 = *local_28d8;
    uStack_28c0 = local_2988[7];
    local_26f0 = local_29b8;
    local_8d0 = &pos_inf;
    local_2978 = local_2988;
    local_2970 = local_2980;
    local_2940 = local_2960;
    local_2910 = local_2930;
    local_2908 = local_2988;
    local_2900 = local_2980;
    local_28e0 = local_2980;
    local_28b0 = local_28d0;
    local_26e8 = local_2980;
    local_26e0 = &local_29e8;
    local_918 = &local_29e8;
    local_910 = &local_29e8;
    local_2a28 = local_28f8;
    uStack_2a20 = uStack_28f0;
    local_2a18 = local_2928;
    uStack_2a10 = uStack_2920;
    local_2a08 = local_2958;
    uStack_2a00 = uStack_2950;
    local_29f8 = local_28c8;
    uStack_29f0 = uStack_28c0;
    local_908 = std::numeric_limits<float>::infinity();
    local_29e8 = CONCAT44(local_908,local_908);
    uStack_29e0 = CONCAT44(local_908,local_908);
    local_8f0 = &local_29d8;
    local_8c8 = &neg_inf;
    fStack_904 = local_908;
    fStack_900 = local_908;
    fStack_8fc = local_908;
    local_8f4 = local_908;
    fVar84 = std::numeric_limits<float>::infinity();
    uVar1 = local_2708;
    uVar9 = local_2728;
    uVar49 = local_27c8;
    uVar57 = local_27e8;
    local_8e8 = -fVar84;
    local_68 = CONCAT44(fVar84,fVar84) ^ 0x8000000080000000;
    uStack_60 = CONCAT44(fVar84,fVar84) ^ 0x8000000080000000;
    local_26cc = *local_26f0;
    local_26d0 = local_26f0[1];
    local_2538 = *(undefined8 *)local_26f0;
    local_26d4 = local_26f0[2];
    local_26c8 = &local_2708;
    local_251c = 0;
    uStack_2530 = (ulong)(uint)local_26d4;
    local_c30 = &local_2718;
    local_c38 = local_26e8;
    local_2708._0_4_ = (float)local_2538;
    local_c24 = (float)local_2708;
    local_c20 = &local_c58;
    local_b08 = CONCAT44((float)local_2708,(float)local_2708);
    uStack_b00 = CONCAT44((float)local_2708,(float)local_2708);
    local_2708._4_4_ = SUB84(uVar1,4);
    local_c04 = local_2708._4_4_;
    local_c00 = &local_c78;
    local_a28 = CONCAT44(local_2708._4_4_,local_2708._4_4_);
    uStack_a20 = CONCAT44(local_2708._4_4_,local_2708._4_4_);
    local_ab8 = local_26e8 + 2;
    local_be4 = (float)uStack_2700;
    local_be0 = &local_c98;
    local_948 = CONCAT44((float)uStack_2700,(float)uStack_2700);
    uStack_940 = CONCAT44((float)uStack_2700,(float)uStack_2700);
    local_9d8 = local_26e8 + 4;
    local_9e0 = local_26e8 + 6;
    local_ac0 = &local_c88;
    local_9b8 = &local_9f8;
    uVar1 = *local_9d8;
    uVar2 = local_26e8[5];
    local_958._0_4_ = (float)uVar1;
    local_958._4_4_ = (float)((ulong)uVar1 >> 0x20);
    uStack_950._0_4_ = (float)uVar2;
    uStack_950._4_4_ = (float)((ulong)uVar2 >> 0x20);
    local_938 = (float)uStack_2700 * (float)local_958;
    fStack_934 = (float)uStack_2700 * local_958._4_4_;
    fStack_930 = (float)uStack_2700 * (float)uStack_950;
    fStack_92c = (float)uStack_2700 * uStack_950._4_4_;
    local_998 = CONCAT44(fStack_934,local_938);
    uStack_990 = CONCAT44(fStack_92c,fStack_930);
    uVar3 = *local_9e0;
    uVar4 = local_26e8[7];
    local_9a8._0_4_ = (float)uVar3;
    local_9a8._4_4_ = (float)((ulong)uVar3 >> 0x20);
    uStack_9a0._0_4_ = (float)uVar4;
    uStack_9a0._4_4_ = (float)((ulong)uVar4 >> 0x20);
    local_988 = local_938 + (float)local_9a8;
    fStack_984 = fStack_934 + local_9a8._4_4_;
    fStack_980 = fStack_930 + (float)uStack_9a0;
    fStack_97c = fStack_92c + uStack_9a0._4_4_;
    local_ba0 = &local_c68;
    local_a98 = &local_ad8;
    uVar5 = *local_ab8;
    uVar6 = local_26e8[3];
    local_a38._0_4_ = (float)uVar5;
    local_a38._4_4_ = (float)((ulong)uVar5 >> 0x20);
    uStack_a30._0_4_ = (float)uVar6;
    uStack_a30._4_4_ = (float)((ulong)uVar6 >> 0x20);
    local_a18 = local_2708._4_4_ * (float)local_a38;
    fStack_a14 = local_2708._4_4_ * local_a38._4_4_;
    fStack_a10 = local_2708._4_4_ * (float)uStack_a30;
    fStack_a0c = local_2708._4_4_ * uStack_a30._4_4_;
    local_a78 = CONCAT44(fStack_a14,local_a18);
    uStack_a70 = CONCAT44(fStack_a0c,fStack_a10);
    local_a88._0_4_ = (float)local_c88;
    local_a88._4_4_ = (float)((ulong)local_c88 >> 0x20);
    uStack_a80._0_4_ = (float)uStack_c80;
    uStack_a80._4_4_ = (float)((ulong)uStack_c80 >> 0x20);
    local_a68 = local_a18 + (float)local_a88;
    fStack_a64 = fStack_a14 + local_a88._4_4_;
    fStack_a60 = fStack_a10 + (float)uStack_a80;
    fStack_a5c = fStack_a0c + uStack_a80._4_4_;
    local_b98 = local_26e8;
    local_b78 = &local_bb8;
    local_b30 = local_26e8;
    uVar7 = *local_26e8;
    uVar8 = local_26e8[1];
    local_b18._0_4_ = (float)uVar7;
    local_b18._4_4_ = (float)((ulong)uVar7 >> 0x20);
    uStack_b10._0_4_ = (float)uVar8;
    uStack_b10._4_4_ = (float)((ulong)uVar8 >> 0x20);
    local_af8 = (float)local_2708 * (float)local_b18;
    fStack_af4 = (float)local_2708 * local_b18._4_4_;
    fStack_af0 = (float)local_2708 * (float)uStack_b10;
    fStack_aec = (float)local_2708 * uStack_b10._4_4_;
    local_b58 = CONCAT44(fStack_af4,local_af8);
    uStack_b50 = CONCAT44(fStack_aec,fStack_af0);
    local_b68._0_4_ = (float)local_c68;
    local_b68._4_4_ = (float)((ulong)local_c68 >> 0x20);
    uStack_b60._0_4_ = (float)uStack_c60;
    uStack_b60._4_4_ = (float)((ulong)uStack_c60 >> 0x20);
    local_b48 = local_af8 + (float)local_b68;
    fStack_b44 = fStack_af4 + local_b68._4_4_;
    fStack_b40 = fStack_af0 + (float)uStack_b60;
    fStack_b3c = fStack_aec + uStack_b60._4_4_;
    local_38 = CONCAT44(fStack_b44,local_b48);
    uStack_30 = CONCAT44(fStack_b3c,fStack_b40);
    local_d0 = &local_108;
    local_28 = local_29e8;
    uStack_20 = uStack_29e0;
    auVar65._8_8_ = uStack_29e0;
    auVar65._0_8_ = local_29e8;
    auVar74._8_8_ = uStack_30;
    auVar74._0_8_ = local_38;
    local_a8 = minps(auVar65,auVar74);
    local_108 = local_a8._0_8_;
    uStack_100 = local_a8._8_8_;
    local_d8 = &local_29d8;
    local_e0 = &local_118;
    auVar66._8_8_ = uStack_60;
    auVar66._0_8_ = local_68;
    local_78 = local_2718;
    uStack_70 = uStack_2710;
    auVar83._8_8_ = uStack_2710;
    auVar83._0_8_ = local_2718;
    local_58 = maxps(auVar66,auVar83);
    local_118 = local_58._0_8_;
    uStack_110 = local_58._8_8_;
    local_26b4 = *local_26f0;
    local_26b8 = local_26f0[1];
    local_2558 = *(undefined8 *)local_26f0;
    local_26bc = local_26f0[6];
    local_26b0 = &local_2728;
    local_253c = 0;
    uStack_2550 = (ulong)(uint)local_26bc;
    local_fb0 = &local_2738;
    local_fb8 = local_26e8;
    local_2728._0_4_ = (float)local_2558;
    local_fa4 = (float)local_2728;
    local_fa0 = &local_fd8;
    local_e88 = CONCAT44((float)local_2728,(float)local_2728);
    uStack_e80 = CONCAT44((float)local_2728,(float)local_2728);
    local_2728._4_4_ = SUB84(uVar9,4);
    local_f84 = local_2728._4_4_;
    local_f80 = &local_ff8;
    local_da8 = CONCAT44(local_2728._4_4_,local_2728._4_4_);
    uStack_da0 = CONCAT44(local_2728._4_4_,local_2728._4_4_);
    local_e38 = local_26e8 + 2;
    local_f64 = (float)uStack_2720;
    local_f60 = &local_1018;
    local_cc8 = CONCAT44((float)uStack_2720,(float)uStack_2720);
    uStack_cc0 = CONCAT44((float)uStack_2720,(float)uStack_2720);
    local_d58 = local_26e8 + 4;
    local_d60 = local_26e8 + 6;
    local_e40 = &local_1008;
    local_d38 = &local_d78;
    uVar9 = *local_d58;
    uVar10 = local_26e8[5];
    local_cd8._0_4_ = (float)uVar9;
    local_cd8._4_4_ = (float)((ulong)uVar9 >> 0x20);
    uStack_cd0._0_4_ = (float)uVar10;
    uStack_cd0._4_4_ = (float)((ulong)uVar10 >> 0x20);
    local_cb8 = (float)uStack_2720 * (float)local_cd8;
    fStack_cb4 = (float)uStack_2720 * local_cd8._4_4_;
    fStack_cb0 = (float)uStack_2720 * (float)uStack_cd0;
    fStack_cac = (float)uStack_2720 * uStack_cd0._4_4_;
    local_d18 = CONCAT44(fStack_cb4,local_cb8);
    uStack_d10 = CONCAT44(fStack_cac,fStack_cb0);
    uVar11 = *local_d60;
    uVar12 = local_26e8[7];
    local_d28._0_4_ = (float)uVar11;
    local_d28._4_4_ = (float)((ulong)uVar11 >> 0x20);
    uStack_d20._0_4_ = (float)uVar12;
    uStack_d20._4_4_ = (float)((ulong)uVar12 >> 0x20);
    local_d08 = local_cb8 + (float)local_d28;
    fStack_d04 = fStack_cb4 + local_d28._4_4_;
    fStack_d00 = fStack_cb0 + (float)uStack_d20;
    fStack_cfc = fStack_cac + uStack_d20._4_4_;
    local_f20 = &local_fe8;
    local_e18 = &local_e58;
    uVar13 = *local_e38;
    uVar14 = local_26e8[3];
    local_db8._0_4_ = (float)uVar13;
    local_db8._4_4_ = (float)((ulong)uVar13 >> 0x20);
    uStack_db0._0_4_ = (float)uVar14;
    uStack_db0._4_4_ = (float)((ulong)uVar14 >> 0x20);
    local_d98 = local_2728._4_4_ * (float)local_db8;
    fStack_d94 = local_2728._4_4_ * local_db8._4_4_;
    fStack_d90 = local_2728._4_4_ * (float)uStack_db0;
    fStack_d8c = local_2728._4_4_ * uStack_db0._4_4_;
    local_df8 = CONCAT44(fStack_d94,local_d98);
    uStack_df0 = CONCAT44(fStack_d8c,fStack_d90);
    local_e08._0_4_ = (float)local_1008;
    local_e08._4_4_ = (float)((ulong)local_1008 >> 0x20);
    uStack_e00._0_4_ = (float)uStack_1000;
    uStack_e00._4_4_ = (float)((ulong)uStack_1000 >> 0x20);
    local_de8 = local_d98 + (float)local_e08;
    fStack_de4 = fStack_d94 + local_e08._4_4_;
    fStack_de0 = fStack_d90 + (float)uStack_e00;
    fStack_ddc = fStack_d8c + uStack_e00._4_4_;
    local_f18 = local_26e8;
    local_ef8 = &local_f38;
    local_eb0 = local_26e8;
    uVar15 = *local_26e8;
    uVar16 = local_26e8[1];
    local_e98._0_4_ = (float)uVar15;
    local_e98._4_4_ = (float)((ulong)uVar15 >> 0x20);
    uStack_e90._0_4_ = (float)uVar16;
    uStack_e90._4_4_ = (float)((ulong)uVar16 >> 0x20);
    local_e78 = (float)local_2728 * (float)local_e98;
    fStack_e74 = (float)local_2728 * local_e98._4_4_;
    fStack_e70 = (float)local_2728 * (float)uStack_e90;
    fStack_e6c = (float)local_2728 * uStack_e90._4_4_;
    local_ed8 = CONCAT44(fStack_e74,local_e78);
    uStack_ed0 = CONCAT44(fStack_e6c,fStack_e70);
    local_ee8._0_4_ = (float)local_fe8;
    local_ee8._4_4_ = (float)((ulong)local_fe8 >> 0x20);
    uStack_ee0._0_4_ = (float)uStack_fe0;
    uStack_ee0._4_4_ = (float)((ulong)uStack_fe0 >> 0x20);
    local_ec8 = local_e78 + (float)local_ee8;
    fStack_ec4 = fStack_e74 + local_ee8._4_4_;
    fStack_ec0 = fStack_e70 + (float)uStack_ee0;
    fStack_ebc = fStack_e6c + uStack_ee0._4_4_;
    local_138 = CONCAT44(fStack_ec4,local_ec8);
    uStack_130 = CONCAT44(fStack_ebc,fStack_ec0);
    local_1d0 = &local_208;
    local_128 = local_a8._0_8_;
    uStack_120 = local_a8._8_8_;
    auVar73._8_8_ = uStack_130;
    auVar73._0_8_ = local_138;
    local_1a8 = minps(local_a8,auVar73);
    local_208 = local_1a8._0_8_;
    uStack_200 = local_1a8._8_8_;
    local_1d8 = &local_29d8;
    local_1e0 = &local_218;
    local_168 = local_58._0_8_;
    uStack_160 = local_58._8_8_;
    local_178 = local_2738;
    uStack_170 = uStack_2730;
    auVar82._8_8_ = uStack_2730;
    auVar82._0_8_ = local_2738;
    local_158 = maxps(local_58,auVar82);
    local_218 = local_158._0_8_;
    uStack_210 = local_158._8_8_;
    local_26a0 = local_26f0[5];
    local_269c = *local_26f0;
    local_26a4 = local_26f0[2];
    local_2698 = &local_2748;
    local_255c = 0;
    local_2578 = CONCAT44(local_26a0,local_269c);
    uStack_2570 = (ulong)(uint)local_26a4;
    local_1330 = &local_2758;
    local_1338 = local_26e8;
    local_1320 = &local_1358;
    local_1208 = CONCAT44(local_269c,local_269c);
    uStack_1200 = CONCAT44(local_269c,local_269c);
    local_1304 = local_2748._4_4_;
    local_1300 = &local_1378;
    local_1128 = CONCAT44(local_2748._4_4_,local_2748._4_4_);
    uStack_1120 = CONCAT44(local_2748._4_4_,local_2748._4_4_);
    local_11b8 = local_26e8 + 2;
    local_12e4 = (float)uStack_2740;
    local_12e0 = &local_1398;
    local_1048 = CONCAT44((float)uStack_2740,(float)uStack_2740);
    uStack_1040 = CONCAT44((float)uStack_2740,(float)uStack_2740);
    local_10d8 = local_26e8 + 4;
    local_10e0 = local_26e8 + 6;
    local_11c0 = &local_1388;
    local_10b8 = &local_10f8;
    uVar17 = *local_10d8;
    uVar18 = local_26e8[5];
    local_1058._0_4_ = (float)uVar17;
    local_1058._4_4_ = (float)((ulong)uVar17 >> 0x20);
    uStack_1050._0_4_ = (float)uVar18;
    uStack_1050._4_4_ = (float)((ulong)uVar18 >> 0x20);
    local_1038 = (float)uStack_2740 * (float)local_1058;
    fStack_1034 = (float)uStack_2740 * local_1058._4_4_;
    fStack_1030 = (float)uStack_2740 * (float)uStack_1050;
    fStack_102c = (float)uStack_2740 * uStack_1050._4_4_;
    local_1098 = CONCAT44(fStack_1034,local_1038);
    uStack_1090 = CONCAT44(fStack_102c,fStack_1030);
    uVar19 = *local_10e0;
    uVar20 = local_26e8[7];
    local_10a8._0_4_ = (float)uVar19;
    local_10a8._4_4_ = (float)((ulong)uVar19 >> 0x20);
    uStack_10a0._0_4_ = (float)uVar20;
    uStack_10a0._4_4_ = (float)((ulong)uVar20 >> 0x20);
    local_1088 = local_1038 + (float)local_10a8;
    fStack_1084 = fStack_1034 + local_10a8._4_4_;
    fStack_1080 = fStack_1030 + (float)uStack_10a0;
    fStack_107c = fStack_102c + uStack_10a0._4_4_;
    local_12a0 = &local_1368;
    local_1198 = &local_11d8;
    uVar21 = *local_11b8;
    uVar22 = local_26e8[3];
    local_1138._0_4_ = (float)uVar21;
    local_1138._4_4_ = (float)((ulong)uVar21 >> 0x20);
    uStack_1130._0_4_ = (float)uVar22;
    uStack_1130._4_4_ = (float)((ulong)uVar22 >> 0x20);
    local_1118 = local_2748._4_4_ * (float)local_1138;
    fStack_1114 = local_2748._4_4_ * local_1138._4_4_;
    fStack_1110 = local_2748._4_4_ * (float)uStack_1130;
    fStack_110c = local_2748._4_4_ * uStack_1130._4_4_;
    local_1178 = CONCAT44(fStack_1114,local_1118);
    uStack_1170 = CONCAT44(fStack_110c,fStack_1110);
    local_1188._0_4_ = (float)local_1388;
    local_1188._4_4_ = (float)((ulong)local_1388 >> 0x20);
    uStack_1180._0_4_ = (float)uStack_1380;
    uStack_1180._4_4_ = (float)((ulong)uStack_1380 >> 0x20);
    local_1168 = local_1118 + (float)local_1188;
    fStack_1164 = fStack_1114 + local_1188._4_4_;
    fStack_1160 = fStack_1110 + (float)uStack_1180;
    fStack_115c = fStack_110c + uStack_1180._4_4_;
    local_1298 = local_26e8;
    local_1278 = &local_12b8;
    local_1230 = local_26e8;
    uVar23 = *local_26e8;
    uVar24 = local_26e8[1];
    local_1218._0_4_ = (float)uVar23;
    local_1218._4_4_ = (float)((ulong)uVar23 >> 0x20);
    uStack_1210._0_4_ = (float)uVar24;
    uStack_1210._4_4_ = (float)((ulong)uVar24 >> 0x20);
    local_11f8 = local_269c * (float)local_1218;
    fStack_11f4 = local_269c * local_1218._4_4_;
    fStack_11f0 = local_269c * (float)uStack_1210;
    fStack_11ec = local_269c * uStack_1210._4_4_;
    local_1258 = CONCAT44(fStack_11f4,local_11f8);
    uStack_1250 = CONCAT44(fStack_11ec,fStack_11f0);
    local_1268._0_4_ = (float)local_1368;
    local_1268._4_4_ = (float)((ulong)local_1368 >> 0x20);
    uStack_1260._0_4_ = (float)uStack_1360;
    uStack_1260._4_4_ = (float)((ulong)uStack_1360 >> 0x20);
    local_1248 = local_11f8 + (float)local_1268;
    fStack_1244 = fStack_11f4 + local_1268._4_4_;
    fStack_1240 = fStack_11f0 + (float)uStack_1260;
    fStack_123c = fStack_11ec + uStack_1260._4_4_;
    local_238 = CONCAT44(fStack_1244,local_1248);
    uStack_230 = CONCAT44(fStack_123c,fStack_1240);
    local_2d0 = &local_308;
    local_228 = local_1a8._0_8_;
    uStack_220 = local_1a8._8_8_;
    auVar72._8_8_ = uStack_230;
    auVar72._0_8_ = local_238;
    local_2a8 = minps(local_1a8,auVar72);
    local_308 = local_2a8._0_8_;
    uStack_300 = local_2a8._8_8_;
    local_2d8 = &local_29d8;
    local_2e0 = &local_318;
    local_268 = local_158._0_8_;
    uStack_260 = local_158._8_8_;
    local_278 = local_2758;
    uStack_270 = uStack_2750;
    auVar81._8_8_ = uStack_2750;
    auVar81._0_8_ = local_2758;
    local_258 = maxps(local_158,auVar81);
    local_318 = local_258._0_8_;
    uStack_310 = local_258._8_8_;
    local_2684 = *local_26f0;
    local_2688 = local_26f0[5];
    local_268c = local_26f0[6];
    local_2680 = &local_2768;
    local_257c = 0;
    local_2598 = CONCAT44(local_2688,local_2684);
    uStack_2590 = (ulong)(uint)local_268c;
    local_16b0 = &local_2778;
    local_16b8 = local_26e8;
    local_16a0 = &local_16d8;
    local_1588 = CONCAT44(local_2684,local_2684);
    uStack_1580 = CONCAT44(local_2684,local_2684);
    local_1684 = local_2768._4_4_;
    local_1680 = &local_16f8;
    local_14a8 = CONCAT44(local_2768._4_4_,local_2768._4_4_);
    uStack_14a0 = CONCAT44(local_2768._4_4_,local_2768._4_4_);
    local_1538 = local_26e8 + 2;
    local_1664 = (float)uStack_2760;
    local_1660 = &local_1718;
    local_13c8 = CONCAT44((float)uStack_2760,(float)uStack_2760);
    uStack_13c0 = CONCAT44((float)uStack_2760,(float)uStack_2760);
    local_1458 = local_26e8 + 4;
    local_1460 = local_26e8 + 6;
    local_1540 = &local_1708;
    local_1438 = &local_1478;
    uVar25 = *local_1458;
    uVar26 = local_26e8[5];
    local_13d8._0_4_ = (float)uVar25;
    local_13d8._4_4_ = (float)((ulong)uVar25 >> 0x20);
    uStack_13d0._0_4_ = (float)uVar26;
    uStack_13d0._4_4_ = (float)((ulong)uVar26 >> 0x20);
    local_13b8 = (float)uStack_2760 * (float)local_13d8;
    fStack_13b4 = (float)uStack_2760 * local_13d8._4_4_;
    fStack_13b0 = (float)uStack_2760 * (float)uStack_13d0;
    fStack_13ac = (float)uStack_2760 * uStack_13d0._4_4_;
    local_1418 = CONCAT44(fStack_13b4,local_13b8);
    uStack_1410 = CONCAT44(fStack_13ac,fStack_13b0);
    uVar27 = *local_1460;
    uVar28 = local_26e8[7];
    local_1428._0_4_ = (float)uVar27;
    local_1428._4_4_ = (float)((ulong)uVar27 >> 0x20);
    uStack_1420._0_4_ = (float)uVar28;
    uStack_1420._4_4_ = (float)((ulong)uVar28 >> 0x20);
    local_1408 = local_13b8 + (float)local_1428;
    fStack_1404 = fStack_13b4 + local_1428._4_4_;
    fStack_1400 = fStack_13b0 + (float)uStack_1420;
    fStack_13fc = fStack_13ac + uStack_1420._4_4_;
    local_1620 = &local_16e8;
    local_1518 = &local_1558;
    uVar29 = *local_1538;
    uVar30 = local_26e8[3];
    local_14b8._0_4_ = (float)uVar29;
    local_14b8._4_4_ = (float)((ulong)uVar29 >> 0x20);
    uStack_14b0._0_4_ = (float)uVar30;
    uStack_14b0._4_4_ = (float)((ulong)uVar30 >> 0x20);
    local_1498 = local_2768._4_4_ * (float)local_14b8;
    fStack_1494 = local_2768._4_4_ * local_14b8._4_4_;
    fStack_1490 = local_2768._4_4_ * (float)uStack_14b0;
    fStack_148c = local_2768._4_4_ * uStack_14b0._4_4_;
    local_14f8 = CONCAT44(fStack_1494,local_1498);
    uStack_14f0 = CONCAT44(fStack_148c,fStack_1490);
    local_1508._0_4_ = (float)local_1708;
    local_1508._4_4_ = (float)((ulong)local_1708 >> 0x20);
    uStack_1500._0_4_ = (float)uStack_1700;
    uStack_1500._4_4_ = (float)((ulong)uStack_1700 >> 0x20);
    local_14e8 = local_1498 + (float)local_1508;
    fStack_14e4 = fStack_1494 + local_1508._4_4_;
    fStack_14e0 = fStack_1490 + (float)uStack_1500;
    fStack_14dc = fStack_148c + uStack_1500._4_4_;
    local_1618 = local_26e8;
    local_15f8 = &local_1638;
    local_15b0 = local_26e8;
    uVar31 = *local_26e8;
    uVar32 = local_26e8[1];
    local_1598._0_4_ = (float)uVar31;
    local_1598._4_4_ = (float)((ulong)uVar31 >> 0x20);
    uStack_1590._0_4_ = (float)uVar32;
    uStack_1590._4_4_ = (float)((ulong)uVar32 >> 0x20);
    local_1578 = local_2684 * (float)local_1598;
    fStack_1574 = local_2684 * local_1598._4_4_;
    fStack_1570 = local_2684 * (float)uStack_1590;
    fStack_156c = local_2684 * uStack_1590._4_4_;
    local_15d8 = CONCAT44(fStack_1574,local_1578);
    uStack_15d0 = CONCAT44(fStack_156c,fStack_1570);
    local_15e8._0_4_ = (float)local_16e8;
    local_15e8._4_4_ = (float)((ulong)local_16e8 >> 0x20);
    uStack_15e0._0_4_ = (float)uStack_16e0;
    uStack_15e0._4_4_ = (float)((ulong)uStack_16e0 >> 0x20);
    local_15c8 = local_1578 + (float)local_15e8;
    fStack_15c4 = fStack_1574 + local_15e8._4_4_;
    fStack_15c0 = fStack_1570 + (float)uStack_15e0;
    fStack_15bc = fStack_156c + uStack_15e0._4_4_;
    local_338 = CONCAT44(fStack_15c4,local_15c8);
    uStack_330 = CONCAT44(fStack_15bc,fStack_15c0);
    local_3d0 = &local_408;
    local_328 = local_2a8._0_8_;
    uStack_320 = local_2a8._8_8_;
    auVar71._8_8_ = uStack_330;
    auVar71._0_8_ = local_338;
    local_3a8 = minps(local_2a8,auVar71);
    local_408 = local_3a8._0_8_;
    uStack_400 = local_3a8._8_8_;
    local_3d8 = &local_29d8;
    local_3e0 = &local_418;
    local_368 = local_258._0_8_;
    uStack_360 = local_258._8_8_;
    local_378 = local_2778;
    uStack_370 = uStack_2770;
    auVar80._8_8_ = uStack_2770;
    auVar80._0_8_ = local_2778;
    local_358 = maxps(local_258,auVar80);
    local_418 = local_358._0_8_;
    uStack_410 = local_358._8_8_;
    local_266c = local_26f0[4];
    local_2670 = local_26f0[1];
    local_2674 = local_26f0[2];
    local_2668 = &local_2788;
    local_259c = 0;
    local_25b8 = CONCAT44(local_2670,local_266c);
    uStack_25b0 = (ulong)(uint)local_2674;
    local_1a30 = &local_2798;
    local_1a38 = local_26e8;
    local_1a20 = &local_1a58;
    local_1908 = CONCAT44(local_266c,local_266c);
    uStack_1900 = CONCAT44(local_266c,local_266c);
    local_1a04 = local_2788._4_4_;
    local_1a00 = &local_1a78;
    local_1828 = CONCAT44(local_2788._4_4_,local_2788._4_4_);
    uStack_1820 = CONCAT44(local_2788._4_4_,local_2788._4_4_);
    local_18b8 = local_26e8 + 2;
    local_19e4 = (float)uStack_2780;
    local_19e0 = &local_1a98;
    local_1748 = CONCAT44((float)uStack_2780,(float)uStack_2780);
    uStack_1740 = CONCAT44((float)uStack_2780,(float)uStack_2780);
    local_17d8 = local_26e8 + 4;
    local_17e0 = local_26e8 + 6;
    local_18c0 = &local_1a88;
    local_17b8 = &local_17f8;
    uVar33 = *local_17d8;
    uVar34 = local_26e8[5];
    local_1758._0_4_ = (float)uVar33;
    local_1758._4_4_ = (float)((ulong)uVar33 >> 0x20);
    uStack_1750._0_4_ = (float)uVar34;
    uStack_1750._4_4_ = (float)((ulong)uVar34 >> 0x20);
    local_1738 = (float)uStack_2780 * (float)local_1758;
    fStack_1734 = (float)uStack_2780 * local_1758._4_4_;
    fStack_1730 = (float)uStack_2780 * (float)uStack_1750;
    fStack_172c = (float)uStack_2780 * uStack_1750._4_4_;
    local_1798 = CONCAT44(fStack_1734,local_1738);
    uStack_1790 = CONCAT44(fStack_172c,fStack_1730);
    uVar35 = *local_17e0;
    uVar36 = local_26e8[7];
    local_17a8._0_4_ = (float)uVar35;
    local_17a8._4_4_ = (float)((ulong)uVar35 >> 0x20);
    uStack_17a0._0_4_ = (float)uVar36;
    uStack_17a0._4_4_ = (float)((ulong)uVar36 >> 0x20);
    local_1788 = local_1738 + (float)local_17a8;
    fStack_1784 = fStack_1734 + local_17a8._4_4_;
    fStack_1780 = fStack_1730 + (float)uStack_17a0;
    fStack_177c = fStack_172c + uStack_17a0._4_4_;
    local_19a0 = &local_1a68;
    local_1898 = &local_18d8;
    uVar37 = *local_18b8;
    uVar38 = local_26e8[3];
    local_1838._0_4_ = (float)uVar37;
    local_1838._4_4_ = (float)((ulong)uVar37 >> 0x20);
    uStack_1830._0_4_ = (float)uVar38;
    uStack_1830._4_4_ = (float)((ulong)uVar38 >> 0x20);
    local_1818 = local_2788._4_4_ * (float)local_1838;
    fStack_1814 = local_2788._4_4_ * local_1838._4_4_;
    fStack_1810 = local_2788._4_4_ * (float)uStack_1830;
    fStack_180c = local_2788._4_4_ * uStack_1830._4_4_;
    local_1878 = CONCAT44(fStack_1814,local_1818);
    uStack_1870 = CONCAT44(fStack_180c,fStack_1810);
    local_1888._0_4_ = (float)local_1a88;
    local_1888._4_4_ = (float)((ulong)local_1a88 >> 0x20);
    uStack_1880._0_4_ = (float)uStack_1a80;
    uStack_1880._4_4_ = (float)((ulong)uStack_1a80 >> 0x20);
    local_1868 = local_1818 + (float)local_1888;
    fStack_1864 = fStack_1814 + local_1888._4_4_;
    fStack_1860 = fStack_1810 + (float)uStack_1880;
    fStack_185c = fStack_180c + uStack_1880._4_4_;
    local_1998 = local_26e8;
    local_1978 = &local_19b8;
    local_1930 = local_26e8;
    uVar39 = *local_26e8;
    uVar40 = local_26e8[1];
    local_1918._0_4_ = (float)uVar39;
    local_1918._4_4_ = (float)((ulong)uVar39 >> 0x20);
    uStack_1910._0_4_ = (float)uVar40;
    uStack_1910._4_4_ = (float)((ulong)uVar40 >> 0x20);
    local_18f8 = local_266c * (float)local_1918;
    fStack_18f4 = local_266c * local_1918._4_4_;
    fStack_18f0 = local_266c * (float)uStack_1910;
    fStack_18ec = local_266c * uStack_1910._4_4_;
    local_1958 = CONCAT44(fStack_18f4,local_18f8);
    uStack_1950 = CONCAT44(fStack_18ec,fStack_18f0);
    local_1968._0_4_ = (float)local_1a68;
    local_1968._4_4_ = (float)((ulong)local_1a68 >> 0x20);
    uStack_1960._0_4_ = (float)uStack_1a60;
    uStack_1960._4_4_ = (float)((ulong)uStack_1a60 >> 0x20);
    local_1948 = local_18f8 + (float)local_1968;
    fStack_1944 = fStack_18f4 + local_1968._4_4_;
    fStack_1940 = fStack_18f0 + (float)uStack_1960;
    fStack_193c = fStack_18ec + uStack_1960._4_4_;
    local_438 = CONCAT44(fStack_1944,local_1948);
    uStack_430 = CONCAT44(fStack_193c,fStack_1940);
    local_4d0 = &local_508;
    local_428 = local_3a8._0_8_;
    uStack_420 = local_3a8._8_8_;
    auVar70._8_8_ = uStack_430;
    auVar70._0_8_ = local_438;
    local_4a8 = minps(local_3a8,auVar70);
    local_508 = local_4a8._0_8_;
    uStack_500 = local_4a8._8_8_;
    local_4d8 = &local_29d8;
    local_4e0 = &local_518;
    local_468 = local_358._0_8_;
    uStack_460 = local_358._8_8_;
    local_478 = local_2798;
    uStack_470 = uStack_2790;
    auVar79._8_8_ = uStack_2790;
    auVar79._0_8_ = local_2798;
    local_458 = maxps(local_358,auVar79);
    local_518 = local_458._0_8_;
    uStack_510 = local_458._8_8_;
    local_2658 = local_26f0[1];
    local_2654 = local_26f0[4];
    local_265c = local_26f0[6];
    local_2650 = &local_27a8;
    local_25bc = 0;
    local_25d8 = CONCAT44(local_2658,local_2654);
    uStack_25d0 = (ulong)(uint)local_265c;
    local_1db0 = &local_27b8;
    local_1db8 = local_26e8;
    local_1da0 = &local_1dd8;
    local_1c88 = CONCAT44(local_2654,local_2654);
    uStack_1c80 = CONCAT44(local_2654,local_2654);
    local_1d84 = local_27a8._4_4_;
    local_1d80 = &local_1df8;
    local_1ba8 = CONCAT44(local_27a8._4_4_,local_27a8._4_4_);
    uStack_1ba0 = CONCAT44(local_27a8._4_4_,local_27a8._4_4_);
    local_1c38 = local_26e8 + 2;
    local_1d64 = (float)uStack_27a0;
    local_1d60 = &local_1e18;
    local_1ac8 = CONCAT44((float)uStack_27a0,(float)uStack_27a0);
    uStack_1ac0 = CONCAT44((float)uStack_27a0,(float)uStack_27a0);
    local_1b58 = local_26e8 + 4;
    local_1b60 = local_26e8 + 6;
    local_1c40 = &local_1e08;
    local_1b38 = &local_1b78;
    uVar41 = *local_1b58;
    uVar42 = local_26e8[5];
    local_1ad8._0_4_ = (float)uVar41;
    local_1ad8._4_4_ = (float)((ulong)uVar41 >> 0x20);
    uStack_1ad0._0_4_ = (float)uVar42;
    uStack_1ad0._4_4_ = (float)((ulong)uVar42 >> 0x20);
    local_1ab8 = (float)uStack_27a0 * (float)local_1ad8;
    fStack_1ab4 = (float)uStack_27a0 * local_1ad8._4_4_;
    fStack_1ab0 = (float)uStack_27a0 * (float)uStack_1ad0;
    fStack_1aac = (float)uStack_27a0 * uStack_1ad0._4_4_;
    local_1b18 = CONCAT44(fStack_1ab4,local_1ab8);
    uStack_1b10 = CONCAT44(fStack_1aac,fStack_1ab0);
    uVar43 = *local_1b60;
    uVar44 = local_26e8[7];
    local_1b28._0_4_ = (float)uVar43;
    local_1b28._4_4_ = (float)((ulong)uVar43 >> 0x20);
    uStack_1b20._0_4_ = (float)uVar44;
    uStack_1b20._4_4_ = (float)((ulong)uVar44 >> 0x20);
    local_1b08 = local_1ab8 + (float)local_1b28;
    fStack_1b04 = fStack_1ab4 + local_1b28._4_4_;
    fStack_1b00 = fStack_1ab0 + (float)uStack_1b20;
    fStack_1afc = fStack_1aac + uStack_1b20._4_4_;
    local_1d20 = &local_1de8;
    local_1c18 = &local_1c58;
    uVar45 = *local_1c38;
    uVar46 = local_26e8[3];
    local_1bb8._0_4_ = (float)uVar45;
    local_1bb8._4_4_ = (float)((ulong)uVar45 >> 0x20);
    uStack_1bb0._0_4_ = (float)uVar46;
    uStack_1bb0._4_4_ = (float)((ulong)uVar46 >> 0x20);
    local_1b98 = local_27a8._4_4_ * (float)local_1bb8;
    fStack_1b94 = local_27a8._4_4_ * local_1bb8._4_4_;
    fStack_1b90 = local_27a8._4_4_ * (float)uStack_1bb0;
    fStack_1b8c = local_27a8._4_4_ * uStack_1bb0._4_4_;
    local_1bf8 = CONCAT44(fStack_1b94,local_1b98);
    uStack_1bf0 = CONCAT44(fStack_1b8c,fStack_1b90);
    local_1c08._0_4_ = (float)local_1e08;
    local_1c08._4_4_ = (float)((ulong)local_1e08 >> 0x20);
    uStack_1c00._0_4_ = (float)uStack_1e00;
    uStack_1c00._4_4_ = (float)((ulong)uStack_1e00 >> 0x20);
    local_1be8 = local_1b98 + (float)local_1c08;
    fStack_1be4 = fStack_1b94 + local_1c08._4_4_;
    fStack_1be0 = fStack_1b90 + (float)uStack_1c00;
    fStack_1bdc = fStack_1b8c + uStack_1c00._4_4_;
    local_1d18 = local_26e8;
    local_1cf8 = &local_1d38;
    local_1cb0 = local_26e8;
    uVar47 = *local_26e8;
    uVar48 = local_26e8[1];
    local_1c98._0_4_ = (float)uVar47;
    local_1c98._4_4_ = (float)((ulong)uVar47 >> 0x20);
    uStack_1c90._0_4_ = (float)uVar48;
    uStack_1c90._4_4_ = (float)((ulong)uVar48 >> 0x20);
    local_1c78 = local_2654 * (float)local_1c98;
    fStack_1c74 = local_2654 * local_1c98._4_4_;
    fStack_1c70 = local_2654 * (float)uStack_1c90;
    fStack_1c6c = local_2654 * uStack_1c90._4_4_;
    local_1cd8 = CONCAT44(fStack_1c74,local_1c78);
    uStack_1cd0 = CONCAT44(fStack_1c6c,fStack_1c70);
    local_1ce8._0_4_ = (float)local_1de8;
    local_1ce8._4_4_ = (float)((ulong)local_1de8 >> 0x20);
    uStack_1ce0._0_4_ = (float)uStack_1de0;
    uStack_1ce0._4_4_ = (float)((ulong)uStack_1de0 >> 0x20);
    local_1cc8 = local_1c78 + (float)local_1ce8;
    fStack_1cc4 = fStack_1c74 + local_1ce8._4_4_;
    fStack_1cc0 = fStack_1c70 + (float)uStack_1ce0;
    fStack_1cbc = fStack_1c6c + uStack_1ce0._4_4_;
    local_538 = CONCAT44(fStack_1cc4,local_1cc8);
    uStack_530 = CONCAT44(fStack_1cbc,fStack_1cc0);
    local_5d0 = &local_608;
    local_528 = local_4a8._0_8_;
    uStack_520 = local_4a8._8_8_;
    auVar69._8_8_ = uStack_530;
    auVar69._0_8_ = local_538;
    local_5a8 = minps(local_4a8,auVar69);
    local_608 = local_5a8._0_8_;
    uStack_600 = local_5a8._8_8_;
    local_5d8 = &local_29d8;
    local_5e0 = &local_618;
    local_568 = local_458._0_8_;
    uStack_560 = local_458._8_8_;
    local_578 = local_27b8;
    uStack_570 = uStack_27b0;
    auVar78._8_8_ = uStack_27b0;
    auVar78._0_8_ = local_27b8;
    local_558 = maxps(local_458,auVar78);
    local_618 = local_558._0_8_;
    uStack_610 = local_558._8_8_;
    local_2644 = local_26f0[2];
    local_263c = local_26f0[4];
    local_2640 = local_26f0[5];
    local_25f8 = *(undefined8 *)(local_26f0 + 4);
    local_2638 = &local_27c8;
    local_25dc = 0;
    uStack_25f0 = (ulong)(uint)local_2644;
    local_2130 = &local_27d8;
    local_2138 = local_26e8;
    local_27c8._0_4_ = (float)local_25f8;
    local_2124 = (float)local_27c8;
    local_2120 = &local_2158;
    local_2008 = CONCAT44((float)local_27c8,(float)local_27c8);
    uStack_2000 = CONCAT44((float)local_27c8,(float)local_27c8);
    local_27c8._4_4_ = SUB84(uVar49,4);
    local_2104 = local_27c8._4_4_;
    local_2100 = &local_2178;
    local_1f28 = CONCAT44(local_27c8._4_4_,local_27c8._4_4_);
    uStack_1f20 = CONCAT44(local_27c8._4_4_,local_27c8._4_4_);
    local_1fb8 = local_26e8 + 2;
    local_20e4 = (float)uStack_27c0;
    local_20e0 = &local_2198;
    local_1e48 = CONCAT44((float)uStack_27c0,(float)uStack_27c0);
    uStack_1e40 = CONCAT44((float)uStack_27c0,(float)uStack_27c0);
    local_1ed8 = local_26e8 + 4;
    local_1ee0 = local_26e8 + 6;
    local_1fc0 = &local_2188;
    local_1eb8 = &local_1ef8;
    uVar49 = *local_1ed8;
    uVar50 = local_26e8[5];
    local_1e58._0_4_ = (float)uVar49;
    local_1e58._4_4_ = (float)((ulong)uVar49 >> 0x20);
    uStack_1e50._0_4_ = (float)uVar50;
    uStack_1e50._4_4_ = (float)((ulong)uVar50 >> 0x20);
    local_1e38 = (float)uStack_27c0 * (float)local_1e58;
    fStack_1e34 = (float)uStack_27c0 * local_1e58._4_4_;
    fStack_1e30 = (float)uStack_27c0 * (float)uStack_1e50;
    fStack_1e2c = (float)uStack_27c0 * uStack_1e50._4_4_;
    local_1e98 = CONCAT44(fStack_1e34,local_1e38);
    uStack_1e90 = CONCAT44(fStack_1e2c,fStack_1e30);
    uVar51 = *local_1ee0;
    uVar52 = local_26e8[7];
    local_1ea8._0_4_ = (float)uVar51;
    local_1ea8._4_4_ = (float)((ulong)uVar51 >> 0x20);
    uStack_1ea0._0_4_ = (float)uVar52;
    uStack_1ea0._4_4_ = (float)((ulong)uVar52 >> 0x20);
    local_1e88 = local_1e38 + (float)local_1ea8;
    fStack_1e84 = fStack_1e34 + local_1ea8._4_4_;
    fStack_1e80 = fStack_1e30 + (float)uStack_1ea0;
    fStack_1e7c = fStack_1e2c + uStack_1ea0._4_4_;
    local_20a0 = &local_2168;
    local_1f98 = &local_1fd8;
    uVar53 = *local_1fb8;
    uVar54 = local_26e8[3];
    local_1f38._0_4_ = (float)uVar53;
    local_1f38._4_4_ = (float)((ulong)uVar53 >> 0x20);
    uStack_1f30._0_4_ = (float)uVar54;
    uStack_1f30._4_4_ = (float)((ulong)uVar54 >> 0x20);
    local_1f18 = local_27c8._4_4_ * (float)local_1f38;
    fStack_1f14 = local_27c8._4_4_ * local_1f38._4_4_;
    fStack_1f10 = local_27c8._4_4_ * (float)uStack_1f30;
    fStack_1f0c = local_27c8._4_4_ * uStack_1f30._4_4_;
    local_1f78 = CONCAT44(fStack_1f14,local_1f18);
    uStack_1f70 = CONCAT44(fStack_1f0c,fStack_1f10);
    local_1f88._0_4_ = (float)local_2188;
    local_1f88._4_4_ = (float)((ulong)local_2188 >> 0x20);
    uStack_1f80._0_4_ = (float)uStack_2180;
    uStack_1f80._4_4_ = (float)((ulong)uStack_2180 >> 0x20);
    local_1f68 = local_1f18 + (float)local_1f88;
    fStack_1f64 = fStack_1f14 + local_1f88._4_4_;
    fStack_1f60 = fStack_1f10 + (float)uStack_1f80;
    fStack_1f5c = fStack_1f0c + uStack_1f80._4_4_;
    local_2098 = local_26e8;
    local_2078 = &local_20b8;
    local_2030 = local_26e8;
    uVar55 = *local_26e8;
    uVar56 = local_26e8[1];
    local_2018._0_4_ = (float)uVar55;
    local_2018._4_4_ = (float)((ulong)uVar55 >> 0x20);
    uStack_2010._0_4_ = (float)uVar56;
    uStack_2010._4_4_ = (float)((ulong)uVar56 >> 0x20);
    local_1ff8 = (float)local_27c8 * (float)local_2018;
    fStack_1ff4 = (float)local_27c8 * local_2018._4_4_;
    fStack_1ff0 = (float)local_27c8 * (float)uStack_2010;
    fStack_1fec = (float)local_27c8 * uStack_2010._4_4_;
    local_2058 = CONCAT44(fStack_1ff4,local_1ff8);
    uStack_2050 = CONCAT44(fStack_1fec,fStack_1ff0);
    local_2068._0_4_ = (float)local_2168;
    local_2068._4_4_ = (float)((ulong)local_2168 >> 0x20);
    uStack_2060._0_4_ = (float)uStack_2160;
    uStack_2060._4_4_ = (float)((ulong)uStack_2160 >> 0x20);
    local_2048 = local_1ff8 + (float)local_2068;
    fStack_2044 = fStack_1ff4 + local_2068._4_4_;
    fStack_2040 = fStack_1ff0 + (float)uStack_2060;
    fStack_203c = fStack_1fec + uStack_2060._4_4_;
    local_638 = CONCAT44(fStack_2044,local_2048);
    uStack_630 = CONCAT44(fStack_203c,fStack_2040);
    local_6d0 = &local_708;
    local_628 = local_5a8._0_8_;
    uStack_620 = local_5a8._8_8_;
    auVar68._8_8_ = uStack_630;
    auVar68._0_8_ = local_638;
    local_6a8 = minps(local_5a8,auVar68);
    local_708 = local_6a8._0_8_;
    uStack_700 = local_6a8._8_8_;
    local_6d8 = &local_29d8;
    local_6e0 = &local_718;
    local_668 = local_558._0_8_;
    uStack_660 = local_558._8_8_;
    local_678 = local_27d8;
    uStack_670 = uStack_27d0;
    auVar77._8_8_ = uStack_27d0;
    auVar77._0_8_ = local_27d8;
    local_658 = maxps(local_558,auVar77);
    local_718 = local_658._0_8_;
    uStack_710 = local_658._8_8_;
    local_2624 = local_26f0[4];
    local_2628 = local_26f0[5];
    local_2618 = *(undefined8 *)(local_26f0 + 4);
    local_262c = local_26f0[6];
    local_2620 = &local_27e8;
    local_25fc = 0;
    uStack_2610 = (ulong)(uint)local_262c;
    local_24b0 = &local_27f8;
    local_24b8 = local_26e8;
    local_27e8._0_4_ = (float)local_2618;
    local_24a4 = (float)local_27e8;
    local_24a0 = &local_24d8;
    local_2388 = CONCAT44((float)local_27e8,(float)local_27e8);
    uStack_2380 = CONCAT44((float)local_27e8,(float)local_27e8);
    local_27e8._4_4_ = SUB84(uVar57,4);
    local_2484 = local_27e8._4_4_;
    local_2480 = &local_24f8;
    local_22a8 = CONCAT44(local_27e8._4_4_,local_27e8._4_4_);
    uStack_22a0 = CONCAT44(local_27e8._4_4_,local_27e8._4_4_);
    local_2338 = local_26e8 + 2;
    local_2464 = (float)uStack_27e0;
    local_2460 = &local_2518;
    local_21c8 = CONCAT44((float)uStack_27e0,(float)uStack_27e0);
    uStack_21c0 = CONCAT44((float)uStack_27e0,(float)uStack_27e0);
    local_2258 = local_26e8 + 4;
    local_2260 = local_26e8 + 6;
    local_2248 = &local_2508;
    local_2250 = &local_2518;
    local_21e0 = &local_2278;
    uVar57 = *local_2258;
    uVar58 = local_26e8[5];
    local_21d8._0_4_ = (float)uVar57;
    local_21d8._4_4_ = (float)((ulong)uVar57 >> 0x20);
    uStack_21d0._0_4_ = (float)uVar58;
    uStack_21d0._4_4_ = (float)((ulong)uVar58 >> 0x20);
    local_21b8 = (float)uStack_27e0 * (float)local_21d8;
    fStack_21b4 = (float)uStack_27e0 * local_21d8._4_4_;
    fStack_21b0 = (float)uStack_27e0 * (float)uStack_21d0;
    fStack_21ac = (float)uStack_27e0 * uStack_21d0._4_4_;
    local_21a0 = &local_2278;
    local_2218 = CONCAT44(fStack_21b4,local_21b8);
    uStack_2210 = CONCAT44(fStack_21ac,fStack_21b0);
    local_2230 = &local_2508;
    local_2238 = &local_2278;
    uVar59 = *local_2260;
    uVar60 = local_26e8[7];
    local_2228._0_4_ = (float)uVar59;
    local_2228._4_4_ = (float)((ulong)uVar59 >> 0x20);
    uStack_2220._0_4_ = (float)uVar60;
    uStack_2220._4_4_ = (float)((ulong)uVar60 >> 0x20);
    local_2208 = local_21b8 + (float)local_2228;
    fStack_2204 = fStack_21b4 + local_2228._4_4_;
    fStack_2200 = fStack_21b0 + (float)uStack_2220;
    fStack_21fc = fStack_21ac + uStack_2220._4_4_;
    local_21f8 = &local_2508;
    local_2328 = &local_24e8;
    local_2330 = &local_24f8;
    local_2340 = &local_2508;
    local_22c0 = &local_2358;
    uVar61 = *local_2338;
    uVar62 = local_26e8[3];
    local_22b8._0_4_ = (float)uVar61;
    local_22b8._4_4_ = (float)((ulong)uVar61 >> 0x20);
    uStack_22b0._0_4_ = (float)uVar62;
    uStack_22b0._4_4_ = (float)((ulong)uVar62 >> 0x20);
    local_2298 = local_27e8._4_4_ * (float)local_22b8;
    fStack_2294 = local_27e8._4_4_ * local_22b8._4_4_;
    fStack_2290 = local_27e8._4_4_ * (float)uStack_22b0;
    fStack_228c = local_27e8._4_4_ * uStack_22b0._4_4_;
    local_2280 = &local_2358;
    local_22f8 = CONCAT44(fStack_2294,local_2298);
    uStack_22f0 = CONCAT44(fStack_228c,fStack_2290);
    local_2310 = &local_24e8;
    local_2318 = &local_2358;
    local_2308._0_4_ = (float)local_2508;
    local_2308._4_4_ = (float)((ulong)local_2508 >> 0x20);
    uStack_2300._0_4_ = (float)uStack_2500;
    uStack_2300._4_4_ = (float)((ulong)uStack_2500 >> 0x20);
    local_22e8 = local_2298 + (float)local_2308;
    fStack_22e4 = fStack_2294 + local_2308._4_4_;
    fStack_22e0 = fStack_2290 + (float)uStack_2300;
    fStack_22dc = fStack_228c + uStack_2300._4_4_;
    local_22d8 = &local_24e8;
    local_2408 = &local_27f8;
    local_2410 = &local_24d8;
    local_2418 = local_26e8;
    local_2420 = &local_24e8;
    local_23a0 = &local_2438;
    local_23b0 = local_26e8;
    uVar63 = *local_26e8;
    uVar64 = local_26e8[1];
    local_2398._0_4_ = (float)uVar63;
    local_2398._4_4_ = (float)((ulong)uVar63 >> 0x20);
    uStack_2390._0_4_ = (float)uVar64;
    uStack_2390._4_4_ = (float)((ulong)uVar64 >> 0x20);
    local_2378 = (float)local_27e8 * (float)local_2398;
    fStack_2374 = (float)local_27e8 * local_2398._4_4_;
    fStack_2370 = (float)local_27e8 * (float)uStack_2390;
    fStack_236c = (float)local_27e8 * uStack_2390._4_4_;
    local_2360 = &local_2438;
    local_23d8 = CONCAT44(fStack_2374,local_2378);
    uStack_23d0 = CONCAT44(fStack_236c,fStack_2370);
    local_23f0 = &local_27f8;
    local_23f8 = &local_2438;
    local_23e8._0_4_ = (float)local_24e8;
    local_23e8._4_4_ = (float)((ulong)local_24e8 >> 0x20);
    uStack_23e0._0_4_ = (float)uStack_24e0;
    uStack_23e0._4_4_ = (float)((ulong)uStack_24e0 >> 0x20);
    local_23c8 = local_2378 + (float)local_23e8;
    fStack_23c4 = fStack_2374 + local_23e8._4_4_;
    fStack_23c0 = fStack_2370 + (float)uStack_23e0;
    fStack_23bc = fStack_236c + uStack_23e0._4_4_;
    local_23b8 = &local_27f8;
    local_738 = CONCAT44(fStack_23c4,local_23c8);
    uStack_730 = CONCAT44(fStack_23bc,fStack_23c0);
    local_7e8 = &local_29e8;
    local_7f0 = &local_27f8;
    local_7b0 = &local_808;
    local_728 = local_6a8._0_8_;
    uStack_720 = local_6a8._8_8_;
    auVar67._8_8_ = uStack_730;
    auVar67._0_8_ = local_738;
    local_7a8 = minps(local_6a8,auVar67);
    local_798 = &local_808;
    local_808 = local_7a8._0_8_;
    uStack_800 = local_7a8._8_8_;
    local_7d0 = &local_808;
    local_29e8 = local_7a8._0_8_;
    uStack_29e0 = local_7a8._8_8_;
    local_788 = &local_29d8;
    local_780 = &local_818;
    local_768 = local_658._0_8_;
    uStack_760 = local_658._8_8_;
    local_778 = local_27f8;
    uStack_770 = uStack_27f0;
    auVar76._8_8_ = uStack_27f0;
    auVar76._0_8_ = local_27f8;
    local_758 = maxps(local_658,auVar76);
    local_740 = &local_818;
    local_818 = local_758._0_8_;
    uStack_810 = local_758._8_8_;
    local_7d8 = &local_29d8;
    local_7e0 = &local_818;
    local_2828 = &local_29e8;
    local_8b0 = &local_2838;
    local_828 = *(undefined8 *)&(in_RDI->lower).field_0;
    uStack_820 = *(undefined8 *)((long)&(in_RDI->lower).field_0 + 8);
    local_838 = local_7a8._0_8_;
    uStack_830 = local_7a8._8_8_;
    local_8a8 = minps((undefined1  [16])(in_RDI->lower).field_0,local_7a8);
    local_898 = &local_2838;
    local_2838 = local_8a8._0_8_;
    uStack_2830 = local_8a8._8_8_;
    local_2808 = &local_2838;
    *(undefined8 *)&(in_RDI->lower).field_0 = local_8a8._0_8_;
    *(undefined8 *)((long)&(in_RDI->lower).field_0 + 8) = local_8a8._8_8_;
    local_888 = &in_RDI->upper;
    local_890 = &local_29d8;
    local_880 = &local_2848;
    local_868 = *(undefined8 *)&local_888->field_0;
    uStack_860 = *(undefined8 *)((long)&(in_RDI->upper).field_0 + 8);
    local_878 = local_29d8;
    uStack_870 = uStack_29d0;
    auVar75._8_8_ = uStack_29d0;
    auVar75._0_8_ = local_29d8;
    local_858 = maxps((undefined1  [16])local_888->field_0,auVar75);
    local_840 = &local_2848;
    local_2848 = local_858._0_8_;
    uStack_2840 = local_858._8_8_;
    local_2810 = &in_RDI->upper;
    local_2818 = &local_2848;
    *(undefined8 *)&local_2810->field_0 = local_858._0_8_;
    *(undefined8 *)((long)&(in_RDI->upper).field_0 + 8) = local_858._8_8_;
    local_2608 = local_2624;
    local_2604 = local_2628;
    local_2600 = local_262c;
    local_25e8 = local_263c;
    local_25e4 = local_2640;
    local_25e0 = local_2644;
    local_25c8 = local_2654;
    local_25c4 = local_2658;
    local_25c0 = local_265c;
    local_25a8 = local_266c;
    local_25a4 = local_2670;
    local_25a0 = local_2674;
    local_2588 = local_2684;
    local_2584 = local_2688;
    local_2580 = local_268c;
    local_2568 = local_269c;
    local_2564 = local_26a0;
    local_2560 = local_26a4;
    local_2548 = local_26b4;
    local_2544 = local_26b8;
    local_2540 = local_26bc;
    local_2528 = local_26cc;
    local_2524 = local_26d0;
    local_2520 = local_26d4;
    local_24c0 = local_2620;
    local_2498 = local_24a4;
    fStack_2494 = local_24a4;
    fStack_2490 = local_24a4;
    fStack_248c = local_24a4;
    local_2488 = local_24a4;
    local_2478 = local_2484;
    fStack_2474 = local_2484;
    fStack_2470 = local_2484;
    fStack_246c = local_2484;
    local_2468 = local_2484;
    local_2458 = local_2464;
    fStack_2454 = local_2464;
    fStack_2450 = local_2464;
    fStack_244c = local_2464;
    local_2448 = local_2464;
    local_2400 = local_2420;
    local_23e8 = local_24e8;
    uStack_23e0 = uStack_24e0;
    local_23a8 = local_2410;
    local_2398 = uVar63;
    uStack_2390 = uVar64;
    local_2320 = local_2340;
    local_2308 = local_2508;
    uStack_2300 = uStack_2500;
    local_22d0 = local_2338;
    local_22c8 = local_2330;
    local_22b8 = uVar61;
    uStack_22b0 = uVar62;
    local_2240 = local_2260;
    local_2228 = uVar59;
    uStack_2220 = uVar60;
    local_21f0 = local_2258;
    local_21e8 = local_2250;
    local_21d8 = uVar57;
    uStack_21d0 = uVar58;
    local_2140 = local_2638;
    local_2118 = local_2124;
    fStack_2114 = local_2124;
    fStack_2110 = local_2124;
    fStack_210c = local_2124;
    local_2108 = local_2124;
    local_20f8 = local_2104;
    fStack_20f4 = local_2104;
    fStack_20f0 = local_2104;
    fStack_20ec = local_2104;
    local_20e8 = local_2104;
    local_20d8 = local_20e4;
    fStack_20d4 = local_20e4;
    fStack_20d0 = local_20e4;
    fStack_20cc = local_20e4;
    local_20bc = local_20e4;
    local_2090 = local_2120;
    local_2088 = local_2130;
    local_2080 = local_20a0;
    local_2070 = local_2130;
    local_2068 = local_2168;
    uStack_2060 = uStack_2160;
    local_2038 = local_2130;
    local_2028 = local_2120;
    local_2020 = local_2078;
    local_2018 = uVar55;
    uStack_2010 = uVar56;
    local_1fe0 = local_2078;
    local_1fb0 = local_2100;
    local_1fa8 = local_20a0;
    local_1fa0 = local_1fc0;
    local_1f90 = local_20a0;
    local_1f88 = local_2188;
    uStack_1f80 = uStack_2180;
    local_1f58 = local_20a0;
    local_1f50 = local_1fb8;
    local_1f48 = local_2100;
    local_1f40 = local_1f98;
    local_1f38 = uVar53;
    uStack_1f30 = uVar54;
    local_1f00 = local_1f98;
    local_1ed0 = local_20e0;
    local_1ec8 = local_1fc0;
    local_1ec0 = local_1ee0;
    local_1eb0 = local_1fc0;
    local_1ea8 = uVar51;
    uStack_1ea0 = uVar52;
    local_1e78 = local_1fc0;
    local_1e70 = local_1ed8;
    local_1e68 = local_20e0;
    local_1e60 = local_1eb8;
    local_1e58 = uVar49;
    uStack_1e50 = uVar50;
    local_1e20 = local_1eb8;
    local_1dc0 = local_2650;
    local_1da4 = local_2654;
    local_1d98 = local_2654;
    fStack_1d94 = local_2654;
    fStack_1d90 = local_2654;
    fStack_1d8c = local_2654;
    local_1d88 = local_2654;
    local_1d78 = local_1d84;
    fStack_1d74 = local_1d84;
    fStack_1d70 = local_1d84;
    fStack_1d6c = local_1d84;
    local_1d68 = local_1d84;
    local_1d58 = local_1d64;
    fStack_1d54 = local_1d64;
    fStack_1d50 = local_1d64;
    fStack_1d4c = local_1d64;
    local_1d3c = local_1d64;
    local_1d10 = local_1da0;
    local_1d08 = local_1db0;
    local_1d00 = local_1d20;
    local_1cf0 = local_1db0;
    local_1ce8 = local_1de8;
    uStack_1ce0 = uStack_1de0;
    local_1cb8 = local_1db0;
    local_1ca8 = local_1da0;
    local_1ca0 = local_1cf8;
    local_1c98 = uVar47;
    uStack_1c90 = uVar48;
    local_1c60 = local_1cf8;
    local_1c30 = local_1d80;
    local_1c28 = local_1d20;
    local_1c20 = local_1c40;
    local_1c10 = local_1d20;
    local_1c08 = local_1e08;
    uStack_1c00 = uStack_1e00;
    local_1bd8 = local_1d20;
    local_1bd0 = local_1c38;
    local_1bc8 = local_1d80;
    local_1bc0 = local_1c18;
    local_1bb8 = uVar45;
    uStack_1bb0 = uVar46;
    local_1b80 = local_1c18;
    local_1b50 = local_1d60;
    local_1b48 = local_1c40;
    local_1b40 = local_1b60;
    local_1b30 = local_1c40;
    local_1b28 = uVar43;
    uStack_1b20 = uVar44;
    local_1af8 = local_1c40;
    local_1af0 = local_1b58;
    local_1ae8 = local_1d60;
    local_1ae0 = local_1b38;
    local_1ad8 = uVar41;
    uStack_1ad0 = uVar42;
    local_1aa0 = local_1b38;
    local_1a40 = local_2668;
    local_1a24 = local_266c;
    local_1a18 = local_266c;
    fStack_1a14 = local_266c;
    fStack_1a10 = local_266c;
    fStack_1a0c = local_266c;
    local_1a08 = local_266c;
    local_19f8 = local_1a04;
    fStack_19f4 = local_1a04;
    fStack_19f0 = local_1a04;
    fStack_19ec = local_1a04;
    local_19e8 = local_1a04;
    local_19d8 = local_19e4;
    fStack_19d4 = local_19e4;
    fStack_19d0 = local_19e4;
    fStack_19cc = local_19e4;
    local_19bc = local_19e4;
    local_1990 = local_1a20;
    local_1988 = local_1a30;
    local_1980 = local_19a0;
    local_1970 = local_1a30;
    local_1968 = local_1a68;
    uStack_1960 = uStack_1a60;
    local_1938 = local_1a30;
    local_1928 = local_1a20;
    local_1920 = local_1978;
    local_1918 = uVar39;
    uStack_1910 = uVar40;
    local_18e0 = local_1978;
    local_18b0 = local_1a00;
    local_18a8 = local_19a0;
    local_18a0 = local_18c0;
    local_1890 = local_19a0;
    local_1888 = local_1a88;
    uStack_1880 = uStack_1a80;
    local_1858 = local_19a0;
    local_1850 = local_18b8;
    local_1848 = local_1a00;
    local_1840 = local_1898;
    local_1838 = uVar37;
    uStack_1830 = uVar38;
    local_1800 = local_1898;
    local_17d0 = local_19e0;
    local_17c8 = local_18c0;
    local_17c0 = local_17e0;
    local_17b0 = local_18c0;
    local_17a8 = uVar35;
    uStack_17a0 = uVar36;
    local_1778 = local_18c0;
    local_1770 = local_17d8;
    local_1768 = local_19e0;
    local_1760 = local_17b8;
    local_1758 = uVar33;
    uStack_1750 = uVar34;
    local_1720 = local_17b8;
    local_16c0 = local_2680;
    local_16a4 = local_2684;
    local_1698 = local_2684;
    fStack_1694 = local_2684;
    fStack_1690 = local_2684;
    fStack_168c = local_2684;
    local_1688 = local_2684;
    local_1678 = local_1684;
    fStack_1674 = local_1684;
    fStack_1670 = local_1684;
    fStack_166c = local_1684;
    local_1668 = local_1684;
    local_1658 = local_1664;
    fStack_1654 = local_1664;
    fStack_1650 = local_1664;
    fStack_164c = local_1664;
    local_163c = local_1664;
    local_1610 = local_16a0;
    local_1608 = local_16b0;
    local_1600 = local_1620;
    local_15f0 = local_16b0;
    local_15e8 = local_16e8;
    uStack_15e0 = uStack_16e0;
    local_15b8 = local_16b0;
    local_15a8 = local_16a0;
    local_15a0 = local_15f8;
    local_1598 = uVar31;
    uStack_1590 = uVar32;
    local_1560 = local_15f8;
    local_1530 = local_1680;
    local_1528 = local_1620;
    local_1520 = local_1540;
    local_1510 = local_1620;
    local_1508 = local_1708;
    uStack_1500 = uStack_1700;
    local_14d8 = local_1620;
    local_14d0 = local_1538;
    local_14c8 = local_1680;
    local_14c0 = local_1518;
    local_14b8 = uVar29;
    uStack_14b0 = uVar30;
    local_1480 = local_1518;
    local_1450 = local_1660;
    local_1448 = local_1540;
    local_1440 = local_1460;
    local_1430 = local_1540;
    local_1428 = uVar27;
    uStack_1420 = uVar28;
    local_13f8 = local_1540;
    local_13f0 = local_1458;
    local_13e8 = local_1660;
    local_13e0 = local_1438;
    local_13d8 = uVar25;
    uStack_13d0 = uVar26;
    local_13a0 = local_1438;
    local_1340 = local_2698;
    local_1324 = local_269c;
    local_1318 = local_269c;
    fStack_1314 = local_269c;
    fStack_1310 = local_269c;
    fStack_130c = local_269c;
    local_1308 = local_269c;
    local_12f8 = local_1304;
    fStack_12f4 = local_1304;
    fStack_12f0 = local_1304;
    fStack_12ec = local_1304;
    local_12e8 = local_1304;
    local_12d8 = local_12e4;
    fStack_12d4 = local_12e4;
    fStack_12d0 = local_12e4;
    fStack_12cc = local_12e4;
    local_12bc = local_12e4;
    local_1290 = local_1320;
    local_1288 = local_1330;
    local_1280 = local_12a0;
    local_1270 = local_1330;
    local_1268 = local_1368;
    uStack_1260 = uStack_1360;
    local_1238 = local_1330;
    local_1228 = local_1320;
    local_1220 = local_1278;
    local_1218 = uVar23;
    uStack_1210 = uVar24;
    local_11e0 = local_1278;
    local_11b0 = local_1300;
    local_11a8 = local_12a0;
    local_11a0 = local_11c0;
    local_1190 = local_12a0;
    local_1188 = local_1388;
    uStack_1180 = uStack_1380;
    local_1158 = local_12a0;
    local_1150 = local_11b8;
    local_1148 = local_1300;
    local_1140 = local_1198;
    local_1138 = uVar21;
    uStack_1130 = uVar22;
    local_1100 = local_1198;
    local_10d0 = local_12e0;
    local_10c8 = local_11c0;
    local_10c0 = local_10e0;
    local_10b0 = local_11c0;
    local_10a8 = uVar19;
    uStack_10a0 = uVar20;
    local_1078 = local_11c0;
    local_1070 = local_10d8;
    local_1068 = local_12e0;
    local_1060 = local_10b8;
    local_1058 = uVar17;
    uStack_1050 = uVar18;
    local_1020 = local_10b8;
    local_fc0 = local_26b0;
    local_f98 = local_fa4;
    fStack_f94 = local_fa4;
    fStack_f90 = local_fa4;
    fStack_f8c = local_fa4;
    local_f88 = local_fa4;
    local_f78 = local_f84;
    fStack_f74 = local_f84;
    fStack_f70 = local_f84;
    fStack_f6c = local_f84;
    local_f68 = local_f84;
    local_f58 = local_f64;
    fStack_f54 = local_f64;
    fStack_f50 = local_f64;
    fStack_f4c = local_f64;
    local_f3c = local_f64;
    local_f10 = local_fa0;
    local_f08 = local_fb0;
    local_f00 = local_f20;
    local_ef0 = local_fb0;
    local_ee8 = local_fe8;
    uStack_ee0 = uStack_fe0;
    local_eb8 = local_fb0;
    local_ea8 = local_fa0;
    local_ea0 = local_ef8;
    local_e98 = uVar15;
    uStack_e90 = uVar16;
    local_e60 = local_ef8;
    local_e30 = local_f80;
    local_e28 = local_f20;
    local_e20 = local_e40;
    local_e10 = local_f20;
    local_e08 = local_1008;
    uStack_e00 = uStack_1000;
    local_dd8 = local_f20;
    local_dd0 = local_e38;
    local_dc8 = local_f80;
    local_dc0 = local_e18;
    local_db8 = uVar13;
    uStack_db0 = uVar14;
    local_d80 = local_e18;
    local_d50 = local_f60;
    local_d48 = local_e40;
    local_d40 = local_d60;
    local_d30 = local_e40;
    local_d28 = uVar11;
    uStack_d20 = uVar12;
    local_cf8 = local_e40;
    local_cf0 = local_d58;
    local_ce8 = local_f60;
    local_ce0 = local_d38;
    local_cd8 = uVar9;
    uStack_cd0 = uVar10;
    local_ca0 = local_d38;
    local_c40 = local_26c8;
    local_c18 = local_c24;
    fStack_c14 = local_c24;
    fStack_c10 = local_c24;
    fStack_c0c = local_c24;
    local_c08 = local_c24;
    local_bf8 = local_c04;
    fStack_bf4 = local_c04;
    fStack_bf0 = local_c04;
    fStack_bec = local_c04;
    local_be8 = local_c04;
    local_bd8 = local_be4;
    fStack_bd4 = local_be4;
    fStack_bd0 = local_be4;
    fStack_bcc = local_be4;
    local_bbc = local_be4;
    local_b90 = local_c20;
    local_b88 = local_c30;
    local_b80 = local_ba0;
    local_b70 = local_c30;
    local_b68 = local_c68;
    uStack_b60 = uStack_c60;
    local_b38 = local_c30;
    local_b28 = local_c20;
    local_b20 = local_b78;
    local_b18 = uVar7;
    uStack_b10 = uVar8;
    local_ae0 = local_b78;
    local_ab0 = local_c00;
    local_aa8 = local_ba0;
    local_aa0 = local_ac0;
    local_a90 = local_ba0;
    local_a88 = local_c88;
    uStack_a80 = uStack_c80;
    local_a58 = local_ba0;
    local_a50 = local_ab8;
    local_a48 = local_c00;
    local_a40 = local_a98;
    local_a38 = uVar5;
    uStack_a30 = uVar6;
    local_a00 = local_a98;
    local_9d0 = local_be0;
    local_9c8 = local_ac0;
    local_9c0 = local_9e0;
    local_9b0 = local_ac0;
    local_9a8 = uVar3;
    uStack_9a0 = uVar4;
    local_978 = local_ac0;
    local_970 = local_9d8;
    local_968 = local_be0;
    local_960 = local_9b8;
    local_958 = uVar1;
    uStack_950 = uVar2;
    local_920 = local_9b8;
    fStack_8e4 = local_8e8;
    fStack_8e0 = local_8e8;
    fStack_8dc = local_8e8;
    local_8d4 = local_8e8;
    local_8c0 = local_2828;
    local_7c8 = local_7e8;
    local_7c0 = local_7f0;
    local_7b8 = local_7e8;
    local_790 = local_7f0;
    local_6f0 = local_2130;
    local_6e8 = &local_29e8;
    local_6c8 = &local_29e8;
    local_6c0 = local_2130;
    local_6b8 = &local_29e8;
    local_6b0 = local_6d0;
    local_698 = local_6d0;
    local_690 = local_2130;
    local_688 = local_6d8;
    local_680 = local_6e0;
    local_640 = local_6e0;
    local_5f0 = local_1db0;
    local_5e8 = &local_29e8;
    local_5c8 = &local_29e8;
    local_5c0 = local_1db0;
    local_5b8 = &local_29e8;
    local_5b0 = local_5d0;
    local_598 = local_5d0;
    local_590 = local_1db0;
    local_588 = local_5d8;
    local_580 = local_5e0;
    local_540 = local_5e0;
    local_4f0 = local_1a30;
    local_4e8 = &local_29e8;
    local_4c8 = &local_29e8;
    local_4c0 = local_1a30;
    local_4b8 = &local_29e8;
    local_4b0 = local_4d0;
    local_498 = local_4d0;
    local_490 = local_1a30;
    local_488 = local_4d8;
    local_480 = local_4e0;
    local_440 = local_4e0;
    local_3f0 = local_16b0;
    local_3e8 = &local_29e8;
    local_3c8 = &local_29e8;
    local_3c0 = local_16b0;
    local_3b8 = &local_29e8;
    local_3b0 = local_3d0;
    local_398 = local_3d0;
    local_390 = local_16b0;
    local_388 = local_3d8;
    local_380 = local_3e0;
    local_340 = local_3e0;
    local_2f0 = local_1330;
    local_2e8 = &local_29e8;
    local_2c8 = &local_29e8;
    local_2c0 = local_1330;
    local_2b8 = &local_29e8;
    local_2b0 = local_2d0;
    local_298 = local_2d0;
    local_290 = local_1330;
    local_288 = local_2d8;
    local_280 = local_2e0;
    local_240 = local_2e0;
    local_1f0 = local_fb0;
    local_1e8 = &local_29e8;
    local_1c8 = &local_29e8;
    local_1c0 = local_fb0;
    local_1b8 = &local_29e8;
    local_1b0 = local_1d0;
    local_198 = local_1d0;
    local_190 = local_fb0;
    local_188 = local_1d8;
    local_180 = local_1e0;
    local_140 = local_1e0;
    local_f0 = local_c30;
    local_e8 = &local_29e8;
    local_c8 = &local_29e8;
    local_c0 = local_c30;
    local_b8 = &local_29e8;
    local_b0 = local_d0;
    local_98 = local_d0;
    local_90 = local_c30;
    local_88 = local_d8;
    local_80 = local_e0;
    local_40 = local_e0;
    local_29d8 = local_758._0_8_;
    uStack_29d0 = local_758._8_8_;
    local_27f8 = local_738;
    uStack_27f0 = uStack_730;
    local_27e8 = local_2618;
    uStack_27e0 = uStack_2610;
    local_27d8 = local_638;
    uStack_27d0 = uStack_630;
    local_27c8 = local_25f8;
    uStack_27c0 = uStack_25f0;
    local_27b8 = local_538;
    uStack_27b0 = uStack_530;
    local_27a8 = local_25d8;
    uStack_27a0 = uStack_25d0;
    local_2798 = local_438;
    uStack_2790 = uStack_430;
    local_2788 = local_25b8;
    uStack_2780 = uStack_25b0;
    local_2778 = local_338;
    uStack_2770 = uStack_330;
    local_2768 = local_2598;
    uStack_2760 = uStack_2590;
    local_2758 = local_238;
    uStack_2750 = uStack_230;
    local_2748 = local_2578;
    uStack_2740 = uStack_2570;
    local_2738 = local_138;
    uStack_2730 = uStack_130;
    local_2728 = local_2558;
    uStack_2720 = uStack_2550;
    local_2718 = local_38;
    uStack_2710 = uStack_30;
    local_2708 = local_2538;
    uStack_2700 = uStack_2530;
    local_2518 = local_21c8;
    uStack_2510 = uStack_21c0;
    local_2508 = CONCAT44(fStack_2204,local_2208);
    uStack_2500 = CONCAT44(fStack_21fc,fStack_2200);
    local_24f8 = local_22a8;
    uStack_24f0 = uStack_22a0;
    local_24e8 = CONCAT44(fStack_22e4,local_22e8);
    uStack_24e0 = CONCAT44(fStack_22dc,fStack_22e0);
    local_24d8 = local_2388;
    uStack_24d0 = uStack_2380;
    local_2438 = local_23d8;
    uStack_2430 = uStack_23d0;
    local_2358 = local_22f8;
    uStack_2350 = uStack_22f0;
    local_2278 = local_2218;
    uStack_2270 = uStack_2210;
    local_2198 = local_1e48;
    uStack_2190 = uStack_1e40;
    local_2188 = CONCAT44(fStack_1e84,local_1e88);
    uStack_2180 = CONCAT44(fStack_1e7c,fStack_1e80);
    local_2178 = local_1f28;
    uStack_2170 = uStack_1f20;
    local_2168 = CONCAT44(fStack_1f64,local_1f68);
    uStack_2160 = CONCAT44(fStack_1f5c,fStack_1f60);
    local_2158 = local_2008;
    uStack_2150 = uStack_2000;
    local_20b8 = local_2058;
    uStack_20b0 = uStack_2050;
    local_1fd8 = local_1f78;
    uStack_1fd0 = uStack_1f70;
    local_1ef8 = local_1e98;
    uStack_1ef0 = uStack_1e90;
    local_1e18 = local_1ac8;
    uStack_1e10 = uStack_1ac0;
    local_1e08 = CONCAT44(fStack_1b04,local_1b08);
    uStack_1e00 = CONCAT44(fStack_1afc,fStack_1b00);
    local_1df8 = local_1ba8;
    uStack_1df0 = uStack_1ba0;
    local_1de8 = CONCAT44(fStack_1be4,local_1be8);
    uStack_1de0 = CONCAT44(fStack_1bdc,fStack_1be0);
    local_1dd8 = local_1c88;
    uStack_1dd0 = uStack_1c80;
    local_1d38 = local_1cd8;
    uStack_1d30 = uStack_1cd0;
    local_1c58 = local_1bf8;
    uStack_1c50 = uStack_1bf0;
    local_1b78 = local_1b18;
    uStack_1b70 = uStack_1b10;
    local_1a98 = local_1748;
    uStack_1a90 = uStack_1740;
    local_1a88 = CONCAT44(fStack_1784,local_1788);
    uStack_1a80 = CONCAT44(fStack_177c,fStack_1780);
    local_1a78 = local_1828;
    uStack_1a70 = uStack_1820;
    local_1a68 = CONCAT44(fStack_1864,local_1868);
    uStack_1a60 = CONCAT44(fStack_185c,fStack_1860);
    local_1a58 = local_1908;
    uStack_1a50 = uStack_1900;
    local_19b8 = local_1958;
    uStack_19b0 = uStack_1950;
    local_18d8 = local_1878;
    uStack_18d0 = uStack_1870;
    local_17f8 = local_1798;
    uStack_17f0 = uStack_1790;
    local_1718 = local_13c8;
    uStack_1710 = uStack_13c0;
    local_1708 = CONCAT44(fStack_1404,local_1408);
    uStack_1700 = CONCAT44(fStack_13fc,fStack_1400);
    local_16f8 = local_14a8;
    uStack_16f0 = uStack_14a0;
    local_16e8 = CONCAT44(fStack_14e4,local_14e8);
    uStack_16e0 = CONCAT44(fStack_14dc,fStack_14e0);
    local_16d8 = local_1588;
    uStack_16d0 = uStack_1580;
    local_1638 = local_15d8;
    uStack_1630 = uStack_15d0;
    local_1558 = local_14f8;
    uStack_1550 = uStack_14f0;
    local_1478 = local_1418;
    uStack_1470 = uStack_1410;
    local_1398 = local_1048;
    uStack_1390 = uStack_1040;
    local_1388 = CONCAT44(fStack_1084,local_1088);
    uStack_1380 = CONCAT44(fStack_107c,fStack_1080);
    local_1378 = local_1128;
    uStack_1370 = uStack_1120;
    local_1368 = CONCAT44(fStack_1164,local_1168);
    uStack_1360 = CONCAT44(fStack_115c,fStack_1160);
    local_1358 = local_1208;
    uStack_1350 = uStack_1200;
    local_12b8 = local_1258;
    uStack_12b0 = uStack_1250;
    local_11d8 = local_1178;
    uStack_11d0 = uStack_1170;
    local_10f8 = local_1098;
    uStack_10f0 = uStack_1090;
    local_1018 = local_cc8;
    uStack_1010 = uStack_cc0;
    local_1008 = CONCAT44(fStack_d04,local_d08);
    uStack_1000 = CONCAT44(fStack_cfc,fStack_d00);
    local_ff8 = local_da8;
    uStack_ff0 = uStack_da0;
    local_fe8 = CONCAT44(fStack_de4,local_de8);
    uStack_fe0 = CONCAT44(fStack_ddc,fStack_de0);
    local_fd8 = local_e88;
    uStack_fd0 = uStack_e80;
    local_f38 = local_ed8;
    uStack_f30 = uStack_ed0;
    local_e58 = local_df8;
    uStack_e50 = uStack_df0;
    local_d78 = local_d18;
    uStack_d70 = uStack_d10;
    local_c98 = local_948;
    uStack_c90 = uStack_940;
    local_c88 = CONCAT44(fStack_984,local_988);
    uStack_c80 = CONCAT44(fStack_97c,fStack_980);
    local_c78 = local_a28;
    uStack_c70 = uStack_a20;
    local_c68 = CONCAT44(fStack_a64,local_a68);
    uStack_c60 = CONCAT44(fStack_a5c,fStack_a60);
    local_c58 = local_b08;
    uStack_c50 = uStack_b00;
    local_bb8 = local_b58;
    uStack_bb0 = uStack_b50;
    local_ad8 = local_a78;
    uStack_ad0 = uStack_a70;
    local_9f8 = local_998;
    uStack_9f0 = uStack_990;
  }
  return in_RDI;
}

Assistant:

BBox3fa bounds ( const BBox3fa& cbounds ) const 
      {
        BBox3fa r = empty;
        for (size_t i=0; i<spaces.size(); i++)
          r.extend(xfmBounds(spaces[i],cbounds));
        return r;
      }